

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [12];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  byte bVar67;
  ulong uVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  ulong uVar72;
  byte bVar73;
  ulong unaff_R13;
  long lVar74;
  bool bVar75;
  bool bVar76;
  ulong uVar77;
  uint uVar78;
  uint uVar131;
  uint uVar132;
  uint uVar134;
  uint uVar135;
  uint uVar136;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  uint uVar133;
  uint uVar137;
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float pp;
  float fVar138;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  float fVar179;
  float fVar180;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar201;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [64];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [64];
  float fVar224;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined4 uVar228;
  undefined1 auVar229 [16];
  undefined1 auVar230 [64];
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar231 [64];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  float fVar243;
  undefined1 auVar241 [32];
  undefined1 auVar242 [64];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [64];
  undefined1 auVar247 [32];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  ulong local_870;
  ulong local_868;
  undefined1 local_860 [32];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  ulong local_808;
  uint local_7fc;
  uint local_7f8;
  undefined4 local_7f4;
  RTCFilterFunctionNArguments local_7f0;
  undefined1 local_7c0 [32];
  undefined8 local_790;
  undefined4 local_788;
  float local_784;
  undefined4 local_780;
  undefined4 local_77c;
  undefined4 local_778;
  uint local_774;
  uint local_770;
  Primitive *local_758;
  ulong local_750;
  ulong local_748;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  float local_600;
  float fStack_5fc;
  float fStack_5f8;
  float fStack_5f4;
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [16];
  undefined1 local_5d0 [16];
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  undefined1 local_5b0 [16];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined4 local_4c0;
  undefined4 uStack_4bc;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  undefined4 uStack_4b0;
  undefined4 uStack_4ac;
  undefined4 uStack_4a8;
  undefined4 uStack_4a4;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar116 [32];
  undefined1 auVar125 [32];
  undefined1 auVar128 [32];
  
  PVar6 = prim[1];
  uVar72 = (ulong)(byte)PVar6;
  fVar224 = *(float *)(prim + uVar72 * 0x19 + 0x12);
  auVar85 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar72 * 0x19 + 6));
  fVar179 = fVar224 * (ray->dir).field_0.m128[0];
  fVar201 = fVar224 * auVar85._0_4_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar92 = vpmovsxbd_avx2(auVar81);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar93 = vpmovsxbd_avx2(auVar82);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar94 = vpmovsxbd_avx2(auVar3);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar72 * 0xb + 6);
  auVar95 = vpmovsxbd_avx2(auVar4);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar96 = vpmovsxbd_avx2(auVar79);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar72 + 6);
  auVar97 = vpmovsxbd_avx2(auVar83);
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar77 = (ulong)(uint)((int)(uVar72 * 9) * 2);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar77 + 6);
  auVar98 = vpmovsxbd_avx2(auVar80);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar77 + uVar72 + 6);
  auVar90 = vpmovsxbd_avx2(auVar84);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar242 = ZEXT3264(auVar98);
  auVar99 = vcvtdq2ps_avx(auVar90);
  auVar246 = ZEXT3264(auVar99);
  uVar68 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar68 + 6);
  auVar100 = vpmovsxbd_avx2(auVar5);
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar248 = ZEXT3264(auVar100);
  auVar106._4_4_ = fVar179;
  auVar106._0_4_ = fVar179;
  auVar106._8_4_ = fVar179;
  auVar106._12_4_ = fVar179;
  auVar106._16_4_ = fVar179;
  auVar106._20_4_ = fVar179;
  auVar106._24_4_ = fVar179;
  auVar106._28_4_ = fVar179;
  auVar86 = vbroadcastss_avx512vl(ZEXT416(1));
  auVar91 = ZEXT1632(CONCAT412(fVar224 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar224 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar224 * (ray->dir).field_0.m128[1],fVar179))));
  auVar87 = vpermps_avx512vl(auVar86,auVar91);
  auVar88 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar89 = vpermps_avx512vl(auVar88,auVar91);
  fVar179 = auVar89._0_4_;
  auVar249._0_4_ = fVar179 * auVar94._0_4_;
  fVar232 = auVar89._4_4_;
  auVar249._4_4_ = fVar232 * auVar94._4_4_;
  fVar234 = auVar89._8_4_;
  auVar249._8_4_ = fVar234 * auVar94._8_4_;
  fVar236 = auVar89._12_4_;
  auVar249._12_4_ = fVar236 * auVar94._12_4_;
  fVar157 = auVar89._16_4_;
  auVar249._16_4_ = fVar157 * auVar94._16_4_;
  fVar159 = auVar89._20_4_;
  auVar249._20_4_ = fVar159 * auVar94._20_4_;
  fVar161 = auVar89._24_4_;
  auVar249._28_36_ = in_ZMM4._28_36_;
  auVar249._24_4_ = fVar161 * auVar94._24_4_;
  auVar91._4_4_ = auVar97._4_4_ * fVar232;
  auVar91._0_4_ = auVar97._0_4_ * fVar179;
  auVar91._8_4_ = auVar97._8_4_ * fVar234;
  auVar91._12_4_ = auVar97._12_4_ * fVar236;
  auVar91._16_4_ = auVar97._16_4_ * fVar157;
  auVar91._20_4_ = auVar97._20_4_ * fVar159;
  auVar91._24_4_ = auVar97._24_4_ * fVar161;
  auVar91._28_4_ = auVar90._28_4_;
  auVar90._4_4_ = auVar100._4_4_ * fVar232;
  auVar90._0_4_ = auVar100._0_4_ * fVar179;
  auVar90._8_4_ = auVar100._8_4_ * fVar234;
  auVar90._12_4_ = auVar100._12_4_ * fVar236;
  auVar90._16_4_ = auVar100._16_4_ * fVar157;
  auVar90._20_4_ = auVar100._20_4_ * fVar159;
  auVar90._24_4_ = auVar100._24_4_ * fVar161;
  auVar90._28_4_ = auVar89._28_4_;
  auVar81 = vfmadd231ps_fma(auVar249._0_32_,auVar87,auVar93);
  auVar82 = vfmadd231ps_fma(auVar91,auVar87,auVar96);
  auVar3 = vfmadd231ps_fma(auVar90,auVar99,auVar87);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar106,auVar92);
  auVar82 = vfmadd231ps_fma(ZEXT1632(auVar82),auVar106,auVar95);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar98,auVar106);
  auVar107._4_4_ = fVar201;
  auVar107._0_4_ = fVar201;
  auVar107._8_4_ = fVar201;
  auVar107._12_4_ = fVar201;
  auVar107._16_4_ = fVar201;
  auVar107._20_4_ = fVar201;
  auVar107._24_4_ = fVar201;
  auVar107._28_4_ = fVar201;
  auVar91 = ZEXT1632(CONCAT412(fVar224 * auVar85._12_4_,
                               CONCAT48(fVar224 * auVar85._8_4_,
                                        CONCAT44(fVar224 * auVar85._4_4_,fVar201))));
  auVar90 = vpermps_avx512vl(auVar86,auVar91);
  auVar91 = vpermps_avx512vl(auVar88,auVar91);
  fVar224 = auVar91._0_4_;
  fVar179 = auVar91._4_4_;
  auVar86._4_4_ = fVar179 * auVar94._4_4_;
  auVar86._0_4_ = fVar224 * auVar94._0_4_;
  fVar232 = auVar91._8_4_;
  auVar86._8_4_ = fVar232 * auVar94._8_4_;
  fVar234 = auVar91._12_4_;
  auVar86._12_4_ = fVar234 * auVar94._12_4_;
  fVar236 = auVar91._16_4_;
  auVar86._16_4_ = fVar236 * auVar94._16_4_;
  fVar157 = auVar91._20_4_;
  auVar86._20_4_ = fVar157 * auVar94._20_4_;
  fVar159 = auVar91._24_4_;
  auVar86._24_4_ = fVar159 * auVar94._24_4_;
  auVar86._28_4_ = auVar94._28_4_;
  auVar102._0_4_ = auVar97._0_4_ * fVar224;
  auVar102._4_4_ = auVar97._4_4_ * fVar179;
  auVar102._8_4_ = auVar97._8_4_ * fVar232;
  auVar102._12_4_ = auVar97._12_4_ * fVar234;
  auVar102._16_4_ = auVar97._16_4_ * fVar236;
  auVar102._20_4_ = auVar97._20_4_ * fVar157;
  auVar102._24_4_ = auVar97._24_4_ * fVar159;
  auVar102._28_4_ = 0;
  auVar97._4_4_ = auVar100._4_4_ * fVar179;
  auVar97._0_4_ = auVar100._0_4_ * fVar224;
  auVar97._8_4_ = auVar100._8_4_ * fVar232;
  auVar97._12_4_ = auVar100._12_4_ * fVar234;
  auVar97._16_4_ = auVar100._16_4_ * fVar236;
  auVar97._20_4_ = auVar100._20_4_ * fVar157;
  auVar97._24_4_ = auVar100._24_4_ * fVar159;
  auVar97._28_4_ = auVar91._28_4_;
  auVar4 = vfmadd231ps_fma(auVar86,auVar90,auVar93);
  auVar79 = vfmadd231ps_fma(auVar102,auVar90,auVar96);
  auVar83 = vfmadd231ps_fma(auVar97,auVar90,auVar99);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar107,auVar92);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar79),auVar107,auVar95);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar107,auVar98);
  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar249 = ZEXT3264(auVar92);
  vandps_avx512vl(ZEXT1632(auVar81),auVar92);
  auVar104._8_4_ = 0x219392ef;
  auVar104._0_8_ = 0x219392ef219392ef;
  auVar104._12_4_ = 0x219392ef;
  auVar104._16_4_ = 0x219392ef;
  auVar104._20_4_ = 0x219392ef;
  auVar104._24_4_ = 0x219392ef;
  auVar104._28_4_ = 0x219392ef;
  uVar77 = vcmpps_avx512vl(auVar92,auVar104,1);
  bVar76 = (bool)((byte)uVar77 & 1);
  auVar87._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar81._0_4_;
  bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar87._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar81._4_4_;
  bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar87._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar81._8_4_;
  bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar87._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar81._12_4_;
  auVar87._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar87._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar87._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar87._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar82),auVar92);
  uVar77 = vcmpps_avx512vl(auVar87,auVar104,1);
  bVar76 = (bool)((byte)uVar77 & 1);
  auVar88._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._0_4_;
  bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._4_4_;
  bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._8_4_;
  bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar82._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar3),auVar92);
  uVar77 = vcmpps_avx512vl(auVar88,auVar104,1);
  bVar76 = (bool)((byte)uVar77 & 1);
  auVar92._0_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar3._0_4_;
  bVar76 = (bool)((byte)(uVar77 >> 1) & 1);
  auVar92._4_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar3._4_4_;
  bVar76 = (bool)((byte)(uVar77 >> 2) & 1);
  auVar92._8_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar3._8_4_;
  bVar76 = (bool)((byte)(uVar77 >> 3) & 1);
  auVar92._12_4_ = (uint)bVar76 * 0x219392ef | (uint)!bVar76 * auVar3._12_4_;
  auVar92._16_4_ = (uint)((byte)(uVar77 >> 4) & 1) * 0x219392ef;
  auVar92._20_4_ = (uint)((byte)(uVar77 >> 5) & 1) * 0x219392ef;
  auVar92._24_4_ = (uint)((byte)(uVar77 >> 6) & 1) * 0x219392ef;
  auVar92._28_4_ = (uint)(byte)(uVar77 >> 7) * 0x219392ef;
  auVar93 = vrcp14ps_avx512vl(auVar87);
  auVar105._8_4_ = 0x3f800000;
  auVar105._0_8_ = &DAT_3f8000003f800000;
  auVar105._12_4_ = 0x3f800000;
  auVar105._16_4_ = 0x3f800000;
  auVar105._20_4_ = 0x3f800000;
  auVar105._24_4_ = 0x3f800000;
  auVar105._28_4_ = 0x3f800000;
  auVar81 = vfnmadd213ps_fma(auVar87,auVar93,auVar105);
  auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar88);
  auVar82 = vfnmadd213ps_fma(auVar88,auVar93,auVar105);
  auVar82 = vfmadd132ps_fma(ZEXT1632(auVar82),auVar93,auVar93);
  auVar93 = vrcp14ps_avx512vl(auVar92);
  auVar3 = vfnmadd213ps_fma(auVar92,auVar93,auVar105);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar93,auVar93);
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar4));
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar98._4_4_ = auVar81._4_4_ * auVar92._4_4_;
  auVar98._0_4_ = auVar81._0_4_ * auVar92._0_4_;
  auVar98._8_4_ = auVar81._8_4_ * auVar92._8_4_;
  auVar98._12_4_ = auVar81._12_4_ * auVar92._12_4_;
  auVar98._16_4_ = auVar92._16_4_ * 0.0;
  auVar98._20_4_ = auVar92._20_4_ * 0.0;
  auVar98._24_4_ = auVar92._24_4_ * 0.0;
  auVar98._28_4_ = auVar92._28_4_;
  auVar92 = vcvtdq2ps_avx(auVar93);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar4));
  auVar103._0_4_ = auVar81._0_4_ * auVar92._0_4_;
  auVar103._4_4_ = auVar81._4_4_ * auVar92._4_4_;
  auVar103._8_4_ = auVar81._8_4_ * auVar92._8_4_;
  auVar103._12_4_ = auVar81._12_4_ * auVar92._12_4_;
  auVar103._16_4_ = auVar92._16_4_ * 0.0;
  auVar103._20_4_ = auVar92._20_4_ * 0.0;
  auVar103._24_4_ = auVar92._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar6 * 0x10 + uVar72 * -2 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar79));
  auVar99._4_4_ = auVar82._4_4_ * auVar92._4_4_;
  auVar99._0_4_ = auVar82._0_4_ * auVar92._0_4_;
  auVar99._8_4_ = auVar82._8_4_ * auVar92._8_4_;
  auVar99._12_4_ = auVar82._12_4_ * auVar92._12_4_;
  auVar99._16_4_ = auVar92._16_4_ * 0.0;
  auVar99._20_4_ = auVar92._20_4_ * 0.0;
  auVar99._24_4_ = auVar92._24_4_ * 0.0;
  auVar99._28_4_ = auVar92._28_4_;
  auVar92 = vcvtdq2ps_avx(auVar93);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar79));
  auVar101._0_4_ = auVar82._0_4_ * auVar92._0_4_;
  auVar101._4_4_ = auVar82._4_4_ * auVar92._4_4_;
  auVar101._8_4_ = auVar82._8_4_ * auVar92._8_4_;
  auVar101._12_4_ = auVar82._12_4_ * auVar92._12_4_;
  auVar101._16_4_ = auVar92._16_4_ * 0.0;
  auVar101._20_4_ = auVar92._20_4_ * 0.0;
  auVar101._24_4_ = auVar92._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar68 + uVar72 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar83));
  auVar100._4_4_ = auVar92._4_4_ * auVar3._4_4_;
  auVar100._0_4_ = auVar92._0_4_ * auVar3._0_4_;
  auVar100._8_4_ = auVar92._8_4_ * auVar3._8_4_;
  auVar100._12_4_ = auVar92._12_4_ * auVar3._12_4_;
  auVar100._16_4_ = auVar92._16_4_ * 0.0;
  auVar100._20_4_ = auVar92._20_4_ * 0.0;
  auVar100._24_4_ = auVar92._24_4_ * 0.0;
  auVar100._28_4_ = auVar92._28_4_;
  auVar92 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x17 + 6));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar92 = vsubps_avx(auVar92,ZEXT1632(auVar83));
  auVar89._0_4_ = auVar3._0_4_ * auVar92._0_4_;
  auVar89._4_4_ = auVar3._4_4_ * auVar92._4_4_;
  auVar89._8_4_ = auVar3._8_4_ * auVar92._8_4_;
  auVar89._12_4_ = auVar3._12_4_ * auVar92._12_4_;
  auVar89._16_4_ = auVar92._16_4_ * 0.0;
  auVar89._20_4_ = auVar92._20_4_ * 0.0;
  auVar89._24_4_ = auVar92._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar92 = vpminsd_avx2(auVar98,auVar103);
  auVar93 = vpminsd_avx2(auVar99,auVar101);
  auVar92 = vmaxps_avx(auVar92,auVar93);
  auVar93 = vpminsd_avx2(auVar100,auVar89);
  uVar228 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar94._4_4_ = uVar228;
  auVar94._0_4_ = uVar228;
  auVar94._8_4_ = uVar228;
  auVar94._12_4_ = uVar228;
  auVar94._16_4_ = uVar228;
  auVar94._20_4_ = uVar228;
  auVar94._24_4_ = uVar228;
  auVar94._28_4_ = uVar228;
  auVar93 = vmaxps_avx512vl(auVar93,auVar94);
  auVar92 = vmaxps_avx(auVar92,auVar93);
  auVar93._8_4_ = 0x3f7ffffa;
  auVar93._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar93._12_4_ = 0x3f7ffffa;
  auVar93._16_4_ = 0x3f7ffffa;
  auVar93._20_4_ = 0x3f7ffffa;
  auVar93._24_4_ = 0x3f7ffffa;
  auVar93._28_4_ = 0x3f7ffffa;
  local_3c0 = vmulps_avx512vl(auVar92,auVar93);
  auVar92 = vpmaxsd_avx2(auVar98,auVar103);
  auVar93 = vpmaxsd_avx2(auVar99,auVar101);
  auVar92 = vminps_avx(auVar92,auVar93);
  auVar93 = vpmaxsd_avx2(auVar100,auVar89);
  fVar224 = ray->tfar;
  auVar95._4_4_ = fVar224;
  auVar95._0_4_ = fVar224;
  auVar95._8_4_ = fVar224;
  auVar95._12_4_ = fVar224;
  auVar95._16_4_ = fVar224;
  auVar95._20_4_ = fVar224;
  auVar95._24_4_ = fVar224;
  auVar95._28_4_ = fVar224;
  auVar93 = vminps_avx512vl(auVar93,auVar95);
  auVar92 = vminps_avx(auVar92,auVar93);
  auVar96._8_4_ = 0x3f800003;
  auVar96._0_8_ = 0x3f8000033f800003;
  auVar96._12_4_ = 0x3f800003;
  auVar96._16_4_ = 0x3f800003;
  auVar96._20_4_ = 0x3f800003;
  auVar96._24_4_ = 0x3f800003;
  auVar96._28_4_ = 0x3f800003;
  auVar92 = vmulps_avx512vl(auVar92,auVar96);
  auVar93 = vpbroadcastd_avx512vl();
  uVar17 = vpcmpgtd_avx512vl(auVar93,_DAT_0205a920);
  uVar16 = vcmpps_avx512vl(local_3c0,auVar92,2);
  bVar75 = (byte)((byte)uVar16 & (byte)uVar17) == 0;
  bVar76 = !bVar75;
  if (bVar75) {
    return bVar76;
  }
  local_750 = (ulong)(byte)((byte)uVar16 & (byte)uVar17);
  local_758 = prim;
LAB_01e0589a:
  lVar74 = 0;
  for (uVar77 = local_750; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
    lVar74 = lVar74 + 1;
  }
  local_868 = (ulong)*(uint *)(prim + 2);
  local_870 = (ulong)*(uint *)(prim + lVar74 * 4 + 6);
  pGVar7 = (context->scene->geometries).items[local_868].ptr;
  uVar77 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_870);
  p_Var8 = pGVar7[1].intersectionFilterN;
  lVar74 = *(long *)&pGVar7[1].time_range.upper;
  auVar81 = *(undefined1 (*) [16])(lVar74 + (long)p_Var8 * uVar77);
  auVar82 = *(undefined1 (*) [16])(lVar74 + (uVar77 + 1) * (long)p_Var8);
  auVar3 = *(undefined1 (*) [16])(lVar74 + (uVar77 + 2) * (long)p_Var8);
  local_750 = local_750 - 1 & local_750;
  auVar4 = *(undefined1 (*) [16])(lVar74 + (uVar77 + 3) * (long)p_Var8);
  if (local_750 != 0) {
    uVar72 = local_750 - 1 & local_750;
    for (uVar77 = local_750; (uVar77 & 1) == 0; uVar77 = uVar77 >> 1 | 0x8000000000000000) {
    }
    if (uVar72 != 0) {
      for (; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar221._0_4_ = auVar81._0_4_ + auVar82._0_4_ + auVar3._0_4_ + auVar4._0_4_;
  auVar221._4_4_ = auVar81._4_4_ + auVar82._4_4_ + auVar3._4_4_ + auVar4._4_4_;
  auVar221._8_4_ = auVar81._8_4_ + auVar82._8_4_ + auVar3._8_4_ + auVar4._8_4_;
  auVar221._12_4_ = auVar81._12_4_ + auVar82._12_4_ + auVar3._12_4_ + auVar4._12_4_;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar85._8_4_ = 0x3e800000;
  auVar85._0_8_ = 0x3e8000003e800000;
  auVar85._12_4_ = 0x3e800000;
  auVar79 = vmulps_avx512vl(auVar221,auVar85);
  auVar79 = vsubps_avx(auVar79,(undefined1  [16])aVar1);
  auVar79 = vdpps_avx(auVar79,(undefined1  [16])aVar2,0x7f);
  auVar83 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar84 = ZEXT816(0) << 0x40;
  auVar239 = ZEXT1664(auVar84);
  auVar229._4_12_ = ZEXT812(0) << 0x20;
  auVar229._0_4_ = auVar83._0_4_;
  auVar80 = vrcp14ss_avx512f(auVar84,auVar229);
  auVar83 = vfnmadd213ss_fma(auVar80,auVar83,ZEXT416(0x40000000));
  fVar224 = auVar79._0_4_ * auVar80._0_4_ * auVar83._0_4_;
  local_610 = ZEXT416((uint)fVar224);
  auVar222._4_4_ = fVar224;
  auVar222._0_4_ = fVar224;
  auVar222._8_4_ = fVar224;
  auVar222._12_4_ = fVar224;
  fStack_730 = fVar224;
  _local_740 = auVar222;
  fStack_72c = fVar224;
  fStack_728 = fVar224;
  fStack_724 = fVar224;
  auVar79 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar222);
  auVar79 = vblendps_avx(auVar79,auVar84,8);
  auVar81 = vsubps_avx(auVar81,auVar79);
  auVar3 = vsubps_avx(auVar3,auVar79);
  uVar228 = *(undefined4 *)&(ray->dir).field_0;
  local_480._4_4_ = uVar228;
  local_480._0_4_ = uVar228;
  local_480._8_4_ = uVar228;
  local_480._12_4_ = uVar228;
  local_480._16_4_ = uVar228;
  local_480._20_4_ = uVar228;
  local_480._24_4_ = uVar228;
  local_480._28_4_ = uVar228;
  auVar230 = ZEXT3264(local_480);
  uVar228 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_4a0._4_4_ = uVar228;
  local_4a0._0_4_ = uVar228;
  local_4a0._8_4_ = uVar228;
  local_4a0._12_4_ = uVar228;
  local_4a0._16_4_ = uVar228;
  local_4a0._20_4_ = uVar228;
  local_4a0._24_4_ = uVar228;
  local_4a0._28_4_ = uVar228;
  auVar231 = ZEXT3264(local_4a0);
  local_4c0 = *(undefined4 *)((long)&(ray->dir).field_0 + 8);
  uStack_4bc = local_4c0;
  uStack_4b8 = local_4c0;
  uStack_4b4 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4ac = local_4c0;
  uStack_4a8 = local_4c0;
  uStack_4a4 = local_4c0;
  auVar82 = vsubps_avx(auVar82,auVar79);
  auVar4 = vsubps_avx(auVar4,auVar79);
  auVar223 = ZEXT1664(auVar4);
  local_1e0 = vbroadcastss_avx512vl(auVar81);
  auVar108._8_4_ = 1;
  auVar108._0_8_ = 0x100000001;
  auVar108._12_4_ = 1;
  auVar108._16_4_ = 1;
  auVar108._20_4_ = 1;
  auVar108._24_4_ = 1;
  auVar108._28_4_ = 1;
  local_680 = ZEXT1632(auVar81);
  local_200 = vpermps_avx512vl(auVar108,local_680);
  auVar111._8_4_ = 2;
  auVar111._0_8_ = 0x200000002;
  auVar111._12_4_ = 2;
  auVar111._16_4_ = 2;
  auVar111._20_4_ = 2;
  auVar111._24_4_ = 2;
  auVar111._28_4_ = 2;
  local_220 = vpermps_avx512vl(auVar111,local_680);
  auVar109._8_4_ = 3;
  auVar109._0_8_ = 0x300000003;
  auVar109._12_4_ = 3;
  auVar109._16_4_ = 3;
  auVar109._20_4_ = 3;
  auVar109._24_4_ = 3;
  auVar109._28_4_ = 3;
  local_1a0 = vpermps_avx2(auVar109,local_680);
  local_240 = vbroadcastss_avx512vl(auVar82);
  local_6c0 = ZEXT1632(auVar82);
  local_260 = vpermps_avx512vl(auVar108,local_6c0);
  local_280 = vpermps_avx512vl(auVar111,local_6c0);
  local_2a0 = vpermps_avx512vl(auVar109,local_6c0);
  local_2c0 = vbroadcastss_avx512vl(auVar3);
  local_6a0 = ZEXT1632(auVar3);
  local_2e0 = vpermps_avx512vl(auVar108,local_6a0);
  local_300 = vpermps_avx512vl(auVar111,local_6a0);
  local_320 = vpermps_avx512vl(auVar109,local_6a0);
  local_340 = vbroadcastss_avx512vl(auVar4);
  _local_6e0 = ZEXT1632(auVar4);
  local_360 = vpermps_avx512vl(auVar108,_local_6e0);
  local_380 = vpermps_avx2(auVar111,_local_6e0);
  local_4e0 = vpermps_avx512vl(auVar109,_local_6e0);
  auVar92 = vpermps_avx2(auVar111,ZEXT1632(CONCAT412(aVar2.field_3.w * aVar2.field_3.w,
                                                     CONCAT48(aVar2.z * aVar2.z,
                                                              CONCAT44(aVar2.y * aVar2.y,
                                                                       aVar2.x * aVar2.x)))));
  auVar81 = vfmadd231ps_fma(auVar92,local_4a0,local_4a0);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),local_480,local_480);
  vandps_avx512vl(ZEXT1632(auVar81),auVar249._0_32_);
  local_808 = 1;
  local_748 = 0;
  bVar69 = 0;
  local_630 = ZEXT816(0x3f80000000000000);
  auVar211 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  local_1c0 = ZEXT1632(auVar81);
  local_3a0 = local_4e0;
  do {
    auVar81 = vmovshdup_avx(local_630);
    fVar224 = local_630._0_4_;
    fVar243 = auVar81._0_4_ - fVar224;
    fVar238 = fVar243 * 0.04761905;
    local_8c0._4_4_ = fVar224;
    local_8c0._0_4_ = fVar224;
    local_8c0._8_4_ = fVar224;
    local_8c0._12_4_ = fVar224;
    local_8c0._16_4_ = fVar224;
    local_8c0._20_4_ = fVar224;
    local_8c0._24_4_ = fVar224;
    local_8c0._28_4_ = fVar224;
    local_700._4_4_ = fVar243;
    local_700._0_4_ = fVar243;
    local_700._8_4_ = fVar243;
    local_700._12_4_ = fVar243;
    local_700._16_4_ = fVar243;
    local_700._20_4_ = fVar243;
    local_700._24_4_ = fVar243;
    local_700._28_4_ = fVar243;
    auVar81 = vfmadd231ps_fma(local_8c0,local_700,_DAT_02020f20);
    auVar111 = auVar211._0_32_;
    auVar92 = vsubps_avx(auVar111,ZEXT1632(auVar81));
    fVar179 = auVar92._0_4_;
    fVar234 = auVar92._4_4_;
    fVar157 = auVar92._8_4_;
    fVar161 = auVar92._12_4_;
    fVar233 = auVar92._16_4_;
    fVar235 = auVar92._20_4_;
    fVar237 = auVar92._24_4_;
    fVar138 = fVar179 * fVar179 * fVar179;
    fVar154 = fVar234 * fVar234 * fVar234;
    auVar33._4_4_ = fVar154;
    auVar33._0_4_ = fVar138;
    fVar155 = fVar157 * fVar157 * fVar157;
    auVar33._8_4_ = fVar155;
    fVar156 = fVar161 * fVar161 * fVar161;
    auVar33._12_4_ = fVar156;
    fVar158 = fVar233 * fVar233 * fVar233;
    auVar33._16_4_ = fVar158;
    fVar160 = fVar235 * fVar235 * fVar235;
    auVar33._20_4_ = fVar160;
    fVar162 = fVar237 * fVar237 * fVar237;
    auVar33._24_4_ = fVar162;
    auVar33._28_4_ = fVar243;
    auVar93 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar94 = vmulps_avx512vl(auVar33,auVar93);
    fVar232 = auVar81._0_4_;
    fVar236 = auVar81._4_4_;
    fVar159 = auVar81._8_4_;
    fVar201 = auVar81._12_4_;
    fVar180 = fVar232 * fVar232 * fVar232;
    fVar198 = fVar236 * fVar236 * fVar236;
    fVar199 = fVar159 * fVar159 * fVar159;
    fVar200 = fVar201 * fVar201 * fVar201;
    auVar240._0_4_ = fVar232 * fVar179;
    auVar240._4_4_ = fVar236 * fVar234;
    auVar240._8_4_ = fVar159 * fVar157;
    auVar240._12_4_ = fVar201 * fVar161;
    auVar240._16_4_ = fVar233 * 0.0;
    auVar240._20_4_ = fVar235 * 0.0;
    auVar240._28_36_ = auVar239._28_36_;
    auVar240._24_4_ = fVar237 * 0.0;
    fVar224 = auVar248._28_4_;
    auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar200,CONCAT48(fVar199,CONCAT44(fVar198,fVar180))
                                                )),auVar93);
    fVar243 = auVar93._28_4_ + fVar243;
    auVar34._4_4_ = fVar154 * 0.16666667;
    auVar34._0_4_ = fVar138 * 0.16666667;
    auVar34._8_4_ = fVar155 * 0.16666667;
    auVar34._12_4_ = fVar156 * 0.16666667;
    auVar34._16_4_ = fVar158 * 0.16666667;
    auVar34._20_4_ = fVar160 * 0.16666667;
    auVar34._24_4_ = fVar162 * 0.16666667;
    auVar34._28_4_ = fVar243;
    auVar35._4_4_ =
         (auVar240._4_4_ * fVar234 * 12.0 + auVar240._4_4_ * fVar236 * 6.0 + fVar198 + auVar94._4_4_
         ) * 0.16666667;
    auVar35._0_4_ =
         (auVar240._0_4_ * fVar179 * 12.0 + auVar240._0_4_ * fVar232 * 6.0 + fVar180 + auVar94._0_4_
         ) * 0.16666667;
    auVar35._8_4_ =
         (auVar240._8_4_ * fVar157 * 12.0 + auVar240._8_4_ * fVar159 * 6.0 + fVar199 + auVar94._8_4_
         ) * 0.16666667;
    auVar35._12_4_ =
         (auVar240._12_4_ * fVar161 * 12.0 + auVar240._12_4_ * fVar201 * 6.0 +
         fVar200 + auVar94._12_4_) * 0.16666667;
    auVar35._16_4_ =
         (auVar240._16_4_ * fVar233 * 12.0 + auVar240._16_4_ * 0.0 * 6.0 + auVar94._16_4_ + 0.0) *
         0.16666667;
    auVar35._20_4_ =
         (auVar240._20_4_ * fVar235 * 12.0 + auVar240._20_4_ * 0.0 * 6.0 + auVar94._20_4_ + 0.0) *
         0.16666667;
    auVar35._24_4_ =
         (auVar240._24_4_ * fVar237 * 12.0 + auVar240._24_4_ * 0.0 * 6.0 + auVar94._24_4_ + 0.0) *
         0.16666667;
    auVar35._28_4_ = auVar246._28_4_;
    auVar36._4_4_ =
         (auVar93._4_4_ + fVar154 + auVar240._4_4_ * fVar236 * 12.0 + auVar240._4_4_ * fVar234 * 6.0
         ) * 0.16666667;
    auVar36._0_4_ =
         (auVar93._0_4_ + fVar138 + auVar240._0_4_ * fVar232 * 12.0 + auVar240._0_4_ * fVar179 * 6.0
         ) * 0.16666667;
    auVar36._8_4_ =
         (auVar93._8_4_ + fVar155 + auVar240._8_4_ * fVar159 * 12.0 + auVar240._8_4_ * fVar157 * 6.0
         ) * 0.16666667;
    auVar36._12_4_ =
         (auVar93._12_4_ + fVar156 +
         auVar240._12_4_ * fVar201 * 12.0 + auVar240._12_4_ * fVar161 * 6.0) * 0.16666667;
    auVar36._16_4_ =
         (auVar93._16_4_ + fVar158 + auVar240._16_4_ * 0.0 * 12.0 + auVar240._16_4_ * fVar233 * 6.0)
         * 0.16666667;
    auVar36._20_4_ =
         (auVar93._20_4_ + fVar160 + auVar240._20_4_ * 0.0 * 12.0 + auVar240._20_4_ * fVar235 * 6.0)
         * 0.16666667;
    auVar36._24_4_ =
         (auVar93._24_4_ + fVar162 + auVar240._24_4_ * 0.0 * 12.0 + auVar240._24_4_ * fVar237 * 6.0)
         * 0.16666667;
    auVar36._28_4_ = fVar224;
    auVar37._28_4_ = fVar243 + auVar246._28_4_ + auVar223._28_4_;
    auVar37._0_28_ =
         ZEXT1628(CONCAT412(fVar200 * 0.16666667,
                            CONCAT48(fVar199 * 0.16666667,
                                     CONCAT44(fVar198 * 0.16666667,fVar180 * 0.16666667))));
    auVar93 = vmulps_avx512vl(local_340,auVar37);
    auVar95 = vmulps_avx512vl(local_360,auVar37);
    auVar38._4_4_ = local_380._4_4_ * fVar198 * 0.16666667;
    auVar38._0_4_ = local_380._0_4_ * fVar180 * 0.16666667;
    auVar38._8_4_ = local_380._8_4_ * fVar199 * 0.16666667;
    auVar38._12_4_ = local_380._12_4_ * fVar200 * 0.16666667;
    auVar38._16_4_ = local_380._16_4_ * 0.0;
    auVar38._20_4_ = local_380._20_4_ * 0.0;
    auVar38._24_4_ = local_380._24_4_ * 0.0;
    auVar38._28_4_ = auVar242._28_4_ + fVar224 + auVar94._28_4_ + 0.0;
    auVar94 = vmulps_avx512vl(local_3a0,auVar37);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar36,local_2c0);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar36,local_2e0);
    auVar96 = vfmadd231ps_avx512vl(auVar38,auVar36,local_300);
    auVar94 = vfmadd231ps_avx512vl(auVar94,local_320,auVar36);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar35,local_240);
    auVar95 = vfmadd231ps_avx512vl(auVar95,auVar35,local_260);
    auVar96 = vfmadd231ps_avx512vl(auVar96,auVar35,local_280);
    auVar94 = vfmadd231ps_avx512vl(auVar94,local_2a0,auVar35);
    auVar97 = vfmadd231ps_avx512vl(auVar93,auVar34,local_1e0);
    local_860 = vfmadd231ps_avx512vl(auVar95,auVar34,local_200);
    local_720 = vfmadd231ps_avx512vl(auVar96,auVar34,local_220);
    auVar82 = vfmadd231ps_fma(auVar94,local_1a0,auVar34);
    auVar96 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar94 = vxorps_avx512vl(auVar92,auVar96);
    auVar95 = vxorps_avx512vl(ZEXT1632(auVar81),auVar96);
    auVar216._0_4_ = auVar95._0_4_ * fVar232;
    auVar216._4_4_ = auVar95._4_4_ * fVar236;
    auVar216._8_4_ = auVar95._8_4_ * fVar159;
    auVar216._12_4_ = auVar95._12_4_ * fVar201;
    auVar216._16_4_ = auVar95._16_4_ * 0.0;
    auVar216._20_4_ = auVar95._20_4_ * 0.0;
    auVar216._24_4_ = auVar95._24_4_ * 0.0;
    auVar216._28_4_ = 0;
    auVar110._8_4_ = 0x40800000;
    auVar110._0_8_ = 0x4080000040800000;
    auVar110._12_4_ = 0x40800000;
    auVar110._16_4_ = 0x40800000;
    auVar110._20_4_ = 0x40800000;
    auVar110._24_4_ = 0x40800000;
    auVar110._28_4_ = 0x40800000;
    auVar98 = vmulps_avx512vl(auVar240._0_32_,auVar110);
    auVar93 = vsubps_avx(auVar216,auVar98);
    auVar39._4_4_ = auVar94._4_4_ * fVar234 * 0.5;
    auVar39._0_4_ = auVar94._0_4_ * fVar179 * 0.5;
    auVar39._8_4_ = auVar94._8_4_ * fVar157 * 0.5;
    auVar39._12_4_ = auVar94._12_4_ * fVar161 * 0.5;
    auVar39._16_4_ = auVar94._16_4_ * fVar233 * 0.5;
    auVar39._20_4_ = auVar94._20_4_ * fVar235 * 0.5;
    auVar39._24_4_ = auVar94._24_4_ * fVar237 * 0.5;
    auVar39._28_4_ = auVar92._28_4_;
    auVar40._4_4_ = auVar93._4_4_ * 0.5;
    auVar40._0_4_ = auVar93._0_4_ * 0.5;
    auVar40._8_4_ = auVar93._8_4_ * 0.5;
    auVar40._12_4_ = auVar93._12_4_ * 0.5;
    auVar40._16_4_ = auVar93._16_4_ * 0.5;
    auVar40._20_4_ = auVar93._20_4_ * 0.5;
    auVar40._24_4_ = auVar93._24_4_ * 0.5;
    auVar40._28_4_ = auVar93._28_4_;
    auVar41._4_4_ = (fVar234 * fVar234 + auVar98._4_4_) * 0.5;
    auVar41._0_4_ = (fVar179 * fVar179 + auVar98._0_4_) * 0.5;
    auVar41._8_4_ = (fVar157 * fVar157 + auVar98._8_4_) * 0.5;
    auVar41._12_4_ = (fVar161 * fVar161 + auVar98._12_4_) * 0.5;
    auVar41._16_4_ = (fVar233 * fVar233 + auVar98._16_4_) * 0.5;
    auVar41._20_4_ = (fVar235 * fVar235 + auVar98._20_4_) * 0.5;
    auVar41._24_4_ = (fVar237 * fVar237 + auVar98._24_4_) * 0.5;
    auVar41._28_4_ = auVar230._28_4_ + auVar98._28_4_;
    fVar179 = fVar232 * fVar232 * 0.5;
    fVar232 = fVar236 * fVar236 * 0.5;
    fVar234 = fVar159 * fVar159 * 0.5;
    fVar236 = fVar201 * fVar201 * 0.5;
    auVar42._28_4_ = auVar231._28_4_;
    auVar42._0_28_ = ZEXT1628(CONCAT412(fVar236,CONCAT48(fVar234,CONCAT44(fVar232,fVar179))));
    auVar92 = vmulps_avx512vl(local_340,auVar42);
    auVar93 = vmulps_avx512vl(local_360,auVar42);
    auVar43._4_4_ = fVar232 * local_380._4_4_;
    auVar43._0_4_ = fVar179 * local_380._0_4_;
    auVar43._8_4_ = fVar234 * local_380._8_4_;
    auVar43._12_4_ = fVar236 * local_380._12_4_;
    auVar43._16_4_ = local_380._16_4_ * 0.0;
    auVar43._20_4_ = local_380._20_4_ * 0.0;
    auVar43._24_4_ = local_380._24_4_ * 0.0;
    auVar43._28_4_ = fVar224;
    auVar94 = vmulps_avx512vl(local_3a0,auVar42);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar41,local_2c0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar41,local_2e0);
    auVar98 = vfmadd231ps_avx512vl(auVar43,auVar41,local_300);
    auVar94 = vfmadd231ps_avx512vl(auVar94,local_320,auVar41);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar40,local_240);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar40,local_260);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar40,local_280);
    auVar94 = vfmadd231ps_avx512vl(auVar94,local_2a0,auVar40);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar39,local_1e0);
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar39,local_200);
    auVar98 = vfmadd231ps_avx512vl(auVar98,auVar39,local_220);
    auVar81 = vfmadd231ps_fma(auVar94,local_1a0,auVar39);
    auVar44._4_4_ = auVar92._4_4_ * fVar238;
    auVar44._0_4_ = auVar92._0_4_ * fVar238;
    auVar44._8_4_ = auVar92._8_4_ * fVar238;
    auVar44._12_4_ = auVar92._12_4_ * fVar238;
    auVar44._16_4_ = auVar92._16_4_ * fVar238;
    auVar44._20_4_ = auVar92._20_4_ * fVar238;
    auVar44._24_4_ = auVar92._24_4_ * fVar238;
    auVar44._28_4_ = auVar95._28_4_;
    auVar242 = ZEXT3264(auVar44);
    auVar45._4_4_ = auVar93._4_4_ * fVar238;
    auVar45._0_4_ = auVar93._0_4_ * fVar238;
    auVar45._8_4_ = auVar93._8_4_ * fVar238;
    auVar45._12_4_ = auVar93._12_4_ * fVar238;
    auVar45._16_4_ = auVar93._16_4_ * fVar238;
    auVar45._20_4_ = auVar93._20_4_ * fVar238;
    auVar45._24_4_ = auVar93._24_4_ * fVar238;
    auVar45._28_4_ = auVar93._28_4_;
    auVar246 = ZEXT3264(auVar45);
    auVar46._4_4_ = auVar98._4_4_ * fVar238;
    auVar46._0_4_ = auVar98._0_4_ * fVar238;
    auVar46._8_4_ = auVar98._8_4_ * fVar238;
    auVar46._12_4_ = auVar98._12_4_ * fVar238;
    auVar46._16_4_ = auVar98._16_4_ * fVar238;
    auVar46._20_4_ = auVar98._20_4_ * fVar238;
    auVar46._24_4_ = auVar98._24_4_ * fVar238;
    auVar46._28_4_ = auVar98._28_4_;
    auVar248 = ZEXT3264(auVar46);
    fVar224 = auVar81._0_4_ * fVar238;
    fVar179 = auVar81._4_4_ * fVar238;
    auVar47._4_4_ = fVar179;
    auVar47._0_4_ = fVar224;
    fVar232 = auVar81._8_4_ * fVar238;
    auVar47._8_4_ = fVar232;
    fVar234 = auVar81._12_4_ * fVar238;
    auVar47._12_4_ = fVar234;
    auVar47._16_4_ = fVar238 * 0.0;
    auVar47._20_4_ = fVar238 * 0.0;
    auVar47._24_4_ = fVar238 * 0.0;
    auVar47._28_4_ = local_380._28_4_;
    auVar81 = vxorps_avx512vl(local_340._0_16_,local_340._0_16_);
    auVar98 = vpermt2ps_avx512vl(auVar97,_DAT_0205fd20,ZEXT1632(auVar81));
    auVar230 = ZEXT3264(auVar98);
    auVar99 = vpermt2ps_avx512vl(local_860,_DAT_0205fd20,ZEXT1632(auVar81));
    auVar231 = ZEXT3264(auVar99);
    auVar94 = ZEXT1632(auVar81);
    auVar100 = vpermt2ps_avx512vl(local_720,_DAT_0205fd20,auVar94);
    auVar239 = ZEXT3264(auVar100);
    auVar217._0_4_ = fVar224 + auVar82._0_4_;
    auVar217._4_4_ = fVar179 + auVar82._4_4_;
    auVar217._8_4_ = fVar232 + auVar82._8_4_;
    auVar217._12_4_ = fVar234 + auVar82._12_4_;
    auVar217._16_4_ = fVar238 * 0.0 + 0.0;
    auVar217._20_4_ = fVar238 * 0.0 + 0.0;
    auVar217._24_4_ = fVar238 * 0.0 + 0.0;
    auVar217._28_4_ = local_380._28_4_ + 0.0;
    auVar92 = vmaxps_avx(ZEXT1632(auVar82),auVar217);
    auVar93 = vminps_avx(ZEXT1632(auVar82),auVar217);
    auVar90 = vpermt2ps_avx512vl(ZEXT1632(auVar82),_DAT_0205fd20,auVar94);
    auVar91 = vpermt2ps_avx512vl(auVar44,_DAT_0205fd20,auVar94);
    auVar86 = vpermt2ps_avx512vl(auVar45,_DAT_0205fd20,auVar94);
    auVar109 = ZEXT1632(auVar81);
    auVar87 = vpermt2ps_avx512vl(auVar46,_DAT_0205fd20,auVar109);
    auVar94 = vpermt2ps_avx512vl(auVar47,_DAT_0205fd20,auVar109);
    auVar88 = vsubps_avx512vl(auVar90,auVar94);
    auVar94 = vsubps_avx(auVar98,auVar97);
    auVar89 = vsubps_avx512vl(auVar99,local_860);
    auVar95 = vsubps_avx(auVar100,local_720);
    auVar223 = ZEXT3264(auVar95);
    auVar101 = vmulps_avx512vl(auVar89,auVar46);
    auVar101 = vfmsub231ps_avx512vl(auVar101,auVar45,auVar95);
    auVar102 = vmulps_avx512vl(auVar95,auVar44);
    auVar102 = vfmsub231ps_avx512vl(auVar102,auVar46,auVar94);
    auVar103 = vmulps_avx512vl(auVar94,auVar45);
    auVar103 = vfmsub231ps_avx512vl(auVar103,auVar44,auVar89);
    auVar103 = vmulps_avx512vl(auVar103,auVar103);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar102,auVar102);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar101,auVar101);
    auVar102 = vmulps_avx512vl(auVar95,auVar95);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar89,auVar89);
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar94,auVar94);
    auVar103 = vrcp14ps_avx512vl(auVar102);
    auVar104 = vfnmadd213ps_avx512vl(auVar103,auVar102,auVar111);
    auVar103 = vfmadd132ps_avx512vl(auVar104,auVar103,auVar103);
    auVar101 = vmulps_avx512vl(auVar101,auVar103);
    auVar104 = vmulps_avx512vl(auVar89,auVar87);
    auVar104 = vfmsub231ps_avx512vl(auVar104,auVar86,auVar95);
    auVar105 = vmulps_avx512vl(auVar95,auVar91);
    auVar105 = vfmsub231ps_avx512vl(auVar105,auVar87,auVar94);
    auVar106 = vmulps_avx512vl(auVar94,auVar86);
    auVar106 = vfmsub231ps_avx512vl(auVar106,auVar91,auVar89);
    auVar106 = vmulps_avx512vl(auVar106,auVar106);
    auVar105 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar105);
    auVar104 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
    auVar103 = vmulps_avx512vl(auVar104,auVar103);
    auVar101 = vmaxps_avx512vl(auVar101,auVar103);
    auVar101 = vsqrtps_avx512vl(auVar101);
    auVar103 = vmaxps_avx512vl(auVar88,auVar90);
    auVar92 = vmaxps_avx512vl(auVar92,auVar103);
    auVar103 = vaddps_avx512vl(auVar101,auVar92);
    auVar92 = vminps_avx512vl(auVar88,auVar90);
    auVar92 = vminps_avx(auVar93,auVar92);
    auVar92 = vsubps_avx512vl(auVar92,auVar101);
    auVar114._8_4_ = 0x3f800002;
    auVar114._0_8_ = 0x3f8000023f800002;
    auVar114._12_4_ = 0x3f800002;
    auVar114._16_4_ = 0x3f800002;
    auVar114._20_4_ = 0x3f800002;
    auVar114._24_4_ = 0x3f800002;
    auVar114._28_4_ = 0x3f800002;
    auVar93 = vmulps_avx512vl(auVar103,auVar114);
    auVar115._8_4_ = 0x3f7ffffc;
    auVar115._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar115._12_4_ = 0x3f7ffffc;
    auVar115._16_4_ = 0x3f7ffffc;
    auVar115._20_4_ = 0x3f7ffffc;
    auVar115._24_4_ = 0x3f7ffffc;
    auVar115._28_4_ = 0x3f7ffffc;
    local_8a0 = vmulps_avx512vl(auVar92,auVar115);
    auVar48._4_4_ = auVar93._4_4_ * auVar93._4_4_;
    auVar48._0_4_ = auVar93._0_4_ * auVar93._0_4_;
    auVar48._8_4_ = auVar93._8_4_ * auVar93._8_4_;
    auVar48._12_4_ = auVar93._12_4_ * auVar93._12_4_;
    auVar48._16_4_ = auVar93._16_4_ * auVar93._16_4_;
    auVar48._20_4_ = auVar93._20_4_ * auVar93._20_4_;
    auVar48._24_4_ = auVar93._24_4_ * auVar93._24_4_;
    auVar48._28_4_ = local_8a0._28_4_;
    auVar92 = vrsqrt14ps_avx512vl(auVar102);
    auVar207._8_4_ = 0xbf000000;
    auVar207._0_8_ = 0xbf000000bf000000;
    auVar207._12_4_ = 0xbf000000;
    auVar207._16_4_ = 0xbf000000;
    auVar207._20_4_ = 0xbf000000;
    auVar207._24_4_ = 0xbf000000;
    auVar207._28_4_ = 0xbf000000;
    auVar93 = vmulps_avx512vl(auVar102,auVar207);
    auVar49._4_4_ = auVar92._4_4_ * auVar93._4_4_;
    auVar49._0_4_ = auVar92._0_4_ * auVar93._0_4_;
    auVar49._8_4_ = auVar92._8_4_ * auVar93._8_4_;
    auVar49._12_4_ = auVar92._12_4_ * auVar93._12_4_;
    auVar49._16_4_ = auVar92._16_4_ * auVar93._16_4_;
    auVar49._20_4_ = auVar92._20_4_ * auVar93._20_4_;
    auVar49._24_4_ = auVar92._24_4_ * auVar93._24_4_;
    auVar49._28_4_ = auVar93._28_4_;
    auVar93 = vmulps_avx512vl(auVar92,auVar92);
    auVar93 = vmulps_avx512vl(auVar93,auVar49);
    auVar22._8_4_ = 0x3fc00000;
    auVar22._0_8_ = 0x3fc000003fc00000;
    auVar22._12_4_ = 0x3fc00000;
    auVar22._16_4_ = 0x3fc00000;
    auVar22._20_4_ = 0x3fc00000;
    auVar22._24_4_ = 0x3fc00000;
    auVar22._28_4_ = 0x3fc00000;
    auVar93 = vfmadd231ps_avx512vl(auVar93,auVar92,auVar22);
    auVar50._4_4_ = auVar93._4_4_ * auVar94._4_4_;
    auVar50._0_4_ = auVar93._0_4_ * auVar94._0_4_;
    auVar50._8_4_ = auVar93._8_4_ * auVar94._8_4_;
    auVar50._12_4_ = auVar93._12_4_ * auVar94._12_4_;
    auVar50._16_4_ = auVar93._16_4_ * auVar94._16_4_;
    auVar50._20_4_ = auVar93._20_4_ * auVar94._20_4_;
    auVar50._24_4_ = auVar93._24_4_ * auVar94._24_4_;
    auVar50._28_4_ = auVar92._28_4_;
    auVar92 = vmulps_avx512vl(auVar89,auVar93);
    auVar90 = vmulps_avx512vl(auVar95,auVar93);
    auVar88 = vsubps_avx512vl(auVar109,auVar97);
    auVar101 = vsubps_avx512vl(auVar109,local_860);
    auVar102 = vsubps_avx512vl(auVar109,local_720);
    auVar65._4_4_ = uStack_4bc;
    auVar65._0_4_ = local_4c0;
    auVar65._8_4_ = uStack_4b8;
    auVar65._12_4_ = uStack_4b4;
    auVar65._16_4_ = uStack_4b0;
    auVar65._20_4_ = uStack_4ac;
    auVar65._24_4_ = uStack_4a8;
    auVar65._28_4_ = uStack_4a4;
    auVar103 = vmulps_avx512vl(auVar65,auVar102);
    auVar103 = vfmadd231ps_avx512vl(auVar103,local_4a0,auVar101);
    auVar103 = vfmadd231ps_avx512vl(auVar103,local_480,auVar88);
    auVar104 = vmulps_avx512vl(auVar102,auVar102);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar101);
    auVar104 = vfmadd231ps_avx512vl(auVar104,auVar88,auVar88);
    auVar105 = vmulps_avx512vl(auVar65,auVar90);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar92,local_4a0);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar50,local_480);
    auVar90 = vmulps_avx512vl(auVar102,auVar90);
    auVar92 = vfmadd231ps_avx512vl(auVar90,auVar101,auVar92);
    auVar92 = vfmadd231ps_avx512vl(auVar92,auVar88,auVar50);
    local_660 = vmulps_avx512vl(auVar105,auVar105);
    auVar90 = vsubps_avx512vl(local_1c0,local_660);
    auVar106 = vmulps_avx512vl(auVar105,auVar92);
    auVar103 = vsubps_avx512vl(auVar103,auVar106);
    auVar103 = vaddps_avx512vl(auVar103,auVar103);
    auVar106 = vmulps_avx512vl(auVar92,auVar92);
    local_7c0 = vsubps_avx512vl(auVar104,auVar106);
    auVar104 = vsubps_avx512vl(local_7c0,auVar48);
    auVar106 = vmulps_avx512vl(auVar103,auVar103);
    auVar23._8_4_ = 0x40800000;
    auVar23._0_8_ = 0x4080000040800000;
    auVar23._12_4_ = 0x40800000;
    auVar23._16_4_ = 0x40800000;
    auVar23._20_4_ = 0x40800000;
    auVar23._24_4_ = 0x40800000;
    auVar23._28_4_ = 0x40800000;
    auVar107 = vmulps_avx512vl(auVar90,auVar23);
    auVar108 = vmulps_avx512vl(auVar107,auVar104);
    auVar108 = vsubps_avx512vl(auVar106,auVar108);
    uVar77 = vcmpps_avx512vl(auVar108,auVar109,5);
    bVar71 = (byte)uVar77;
    if (bVar71 == 0) {
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar113 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar108 = vsqrtps_avx512vl(auVar108);
      auVar109 = vaddps_avx512vl(auVar90,auVar90);
      auVar110 = vrcp14ps_avx512vl(auVar109);
      auVar111 = vfnmadd213ps_avx512vl(auVar109,auVar110,auVar111);
      auVar111 = vfmadd132ps_avx512vl(auVar111,auVar110,auVar110);
      auVar96 = vxorps_avx512vl(auVar103,auVar96);
      auVar96 = vsubps_avx512vl(auVar96,auVar108);
      auVar96 = vmulps_avx512vl(auVar96,auVar111);
      auVar108 = vsubps_avx512vl(auVar108,auVar103);
      auVar108 = vmulps_avx512vl(auVar108,auVar111);
      auVar111 = vfmadd213ps_avx512vl(auVar105,auVar96,auVar92);
      local_520 = vmulps_avx512vl(auVar93,auVar111);
      auVar111 = vfmadd213ps_avx512vl(auVar105,auVar108,auVar92);
      local_540 = vmulps_avx512vl(auVar93,auVar111);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar96 = vblendmps_avx512vl(auVar111,auVar96);
      auVar112._0_4_ =
           (uint)(bVar71 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar71 & 1) * local_540._0_4_;
      bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar112._4_4_ = (uint)bVar75 * auVar96._4_4_ | (uint)!bVar75 * local_540._4_4_;
      bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar112._8_4_ = (uint)bVar75 * auVar96._8_4_ | (uint)!bVar75 * local_540._8_4_;
      bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar112._12_4_ = (uint)bVar75 * auVar96._12_4_ | (uint)!bVar75 * local_540._12_4_;
      bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar112._16_4_ = (uint)bVar75 * auVar96._16_4_ | (uint)!bVar75 * local_540._16_4_;
      bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar112._20_4_ = (uint)bVar75 * auVar96._20_4_ | (uint)!bVar75 * local_540._20_4_;
      bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar112._24_4_ = (uint)bVar75 * auVar96._24_4_ | (uint)!bVar75 * local_540._24_4_;
      bVar75 = SUB81(uVar77 >> 7,0);
      auVar112._28_4_ = (uint)bVar75 * auVar96._28_4_ | (uint)!bVar75 * local_540._28_4_;
      auVar206._8_4_ = 0xff800000;
      auVar206._0_8_ = 0xff800000ff800000;
      auVar206._12_4_ = 0xff800000;
      auVar206._16_4_ = 0xff800000;
      auVar206._20_4_ = 0xff800000;
      auVar206._24_4_ = 0xff800000;
      auVar206._28_4_ = 0xff800000;
      auVar96 = vblendmps_avx512vl(auVar206,auVar108);
      auVar113._0_4_ =
           (uint)(bVar71 & 1) * auVar96._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar108._0_4_;
      bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
      auVar113._4_4_ = (uint)bVar75 * auVar96._4_4_ | (uint)!bVar75 * auVar108._4_4_;
      bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
      auVar113._8_4_ = (uint)bVar75 * auVar96._8_4_ | (uint)!bVar75 * auVar108._8_4_;
      bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
      auVar113._12_4_ = (uint)bVar75 * auVar96._12_4_ | (uint)!bVar75 * auVar108._12_4_;
      bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
      auVar113._16_4_ = (uint)bVar75 * auVar96._16_4_ | (uint)!bVar75 * auVar108._16_4_;
      bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
      auVar113._20_4_ = (uint)bVar75 * auVar96._20_4_ | (uint)!bVar75 * auVar108._20_4_;
      bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
      auVar113._24_4_ = (uint)bVar75 * auVar96._24_4_ | (uint)!bVar75 * auVar108._24_4_;
      bVar75 = SUB81(uVar77 >> 7,0);
      auVar113._28_4_ = (uint)bVar75 * auVar96._28_4_ | (uint)!bVar75 * auVar108._28_4_;
      auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_660,auVar96);
      auVar108 = vmaxps_avx512vl(local_4e0,auVar96);
      auVar24._8_4_ = 0x36000000;
      auVar24._0_8_ = 0x3600000036000000;
      auVar24._12_4_ = 0x36000000;
      auVar24._16_4_ = 0x36000000;
      auVar24._20_4_ = 0x36000000;
      auVar24._24_4_ = 0x36000000;
      auVar24._28_4_ = 0x36000000;
      auVar108 = vmulps_avx512vl(auVar108,auVar24);
      vandps_avx512vl(auVar90,auVar96);
      uVar72 = vcmpps_avx512vl(auVar108,auVar108,1);
      uVar77 = uVar77 & uVar72;
      bVar73 = (byte)uVar77;
      if (bVar73 != 0) {
        uVar72 = vcmpps_avx512vl(auVar104,_DAT_02020f00,2);
        auVar220._8_4_ = 0xff800000;
        auVar220._0_8_ = 0xff800000ff800000;
        auVar220._12_4_ = 0xff800000;
        auVar220._16_4_ = 0xff800000;
        auVar220._20_4_ = 0xff800000;
        auVar220._24_4_ = 0xff800000;
        auVar220._28_4_ = 0xff800000;
        auVar96 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar104 = vblendmps_avx512vl(auVar96,auVar220);
        bVar70 = (byte)uVar72;
        uVar78 = (uint)(bVar70 & 1) * auVar104._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar108._0_4_;
        bVar75 = (bool)((byte)(uVar72 >> 1) & 1);
        uVar131 = (uint)bVar75 * auVar104._4_4_ | (uint)!bVar75 * auVar108._4_4_;
        bVar75 = (bool)((byte)(uVar72 >> 2) & 1);
        uVar132 = (uint)bVar75 * auVar104._8_4_ | (uint)!bVar75 * auVar108._8_4_;
        bVar75 = (bool)((byte)(uVar72 >> 3) & 1);
        uVar133 = (uint)bVar75 * auVar104._12_4_ | (uint)!bVar75 * auVar108._12_4_;
        bVar75 = (bool)((byte)(uVar72 >> 4) & 1);
        uVar134 = (uint)bVar75 * auVar104._16_4_ | (uint)!bVar75 * auVar108._16_4_;
        bVar75 = (bool)((byte)(uVar72 >> 5) & 1);
        uVar135 = (uint)bVar75 * auVar104._20_4_ | (uint)!bVar75 * auVar108._20_4_;
        bVar75 = (bool)((byte)(uVar72 >> 6) & 1);
        uVar136 = (uint)bVar75 * auVar104._24_4_ | (uint)!bVar75 * auVar108._24_4_;
        bVar75 = SUB81(uVar72 >> 7,0);
        uVar137 = (uint)bVar75 * auVar104._28_4_ | (uint)!bVar75 * auVar108._28_4_;
        auVar112._0_4_ = (bVar73 & 1) * uVar78 | !(bool)(bVar73 & 1) * auVar112._0_4_;
        bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar112._4_4_ = bVar75 * uVar131 | !bVar75 * auVar112._4_4_;
        bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar112._8_4_ = bVar75 * uVar132 | !bVar75 * auVar112._8_4_;
        bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar112._12_4_ = bVar75 * uVar133 | !bVar75 * auVar112._12_4_;
        bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar112._16_4_ = bVar75 * uVar134 | !bVar75 * auVar112._16_4_;
        bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar112._20_4_ = bVar75 * uVar135 | !bVar75 * auVar112._20_4_;
        bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar112._24_4_ = bVar75 * uVar136 | !bVar75 * auVar112._24_4_;
        bVar75 = SUB81(uVar77 >> 7,0);
        auVar112._28_4_ = bVar75 * uVar137 | !bVar75 * auVar112._28_4_;
        auVar96 = vblendmps_avx512vl(auVar220,auVar96);
        bVar75 = (bool)((byte)(uVar72 >> 1) & 1);
        bVar10 = (bool)((byte)(uVar72 >> 2) & 1);
        bVar11 = (bool)((byte)(uVar72 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar72 >> 4) & 1);
        bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
        bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
        bVar15 = SUB81(uVar72 >> 7,0);
        auVar113._0_4_ =
             (uint)(bVar73 & 1) *
             ((uint)(bVar70 & 1) * auVar96._0_4_ | !(bool)(bVar70 & 1) * uVar78) |
             !(bool)(bVar73 & 1) * auVar113._0_4_;
        bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
        auVar113._4_4_ =
             (uint)bVar9 * ((uint)bVar75 * auVar96._4_4_ | !bVar75 * uVar131) |
             !bVar9 * auVar113._4_4_;
        bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
        auVar113._8_4_ =
             (uint)bVar75 * ((uint)bVar10 * auVar96._8_4_ | !bVar10 * uVar132) |
             !bVar75 * auVar113._8_4_;
        bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
        auVar113._12_4_ =
             (uint)bVar75 * ((uint)bVar11 * auVar96._12_4_ | !bVar11 * uVar133) |
             !bVar75 * auVar113._12_4_;
        bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
        auVar113._16_4_ =
             (uint)bVar75 * ((uint)bVar12 * auVar96._16_4_ | !bVar12 * uVar134) |
             !bVar75 * auVar113._16_4_;
        bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
        auVar113._20_4_ =
             (uint)bVar75 * ((uint)bVar13 * auVar96._20_4_ | !bVar13 * uVar135) |
             !bVar75 * auVar113._20_4_;
        bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
        auVar113._24_4_ =
             (uint)bVar75 * ((uint)bVar14 * auVar96._24_4_ | !bVar14 * uVar136) |
             !bVar75 * auVar113._24_4_;
        bVar75 = SUB81(uVar77 >> 7,0);
        auVar113._28_4_ =
             (uint)bVar75 * ((uint)bVar15 * auVar96._28_4_ | !bVar15 * uVar137) |
             !bVar75 * auVar113._28_4_;
        bVar71 = (~bVar73 | bVar70) & bVar71;
      }
      auVar211 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    fVar224 = (float)local_740._0_4_;
    fVar179 = (float)local_740._4_4_;
    fVar232 = fStack_738;
    fVar234 = fStack_734;
    fVar236 = fStack_730;
    fVar157 = fStack_72c;
    fVar159 = fStack_728;
    fVar161 = fStack_724;
    if ((bVar71 & 0x7f) == 0) {
      auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar249 = ZEXT3264(auVar92);
    }
    else {
      auVar207 = auVar211._0_32_;
      auVar81 = vsubss_avx512f(ZEXT416((uint)(ray->org).field_0.m128[3]),local_610);
      auVar208._0_4_ = auVar81._0_4_;
      auVar208._4_4_ = auVar208._0_4_;
      auVar208._8_4_ = auVar208._0_4_;
      auVar208._12_4_ = auVar208._0_4_;
      auVar208._16_4_ = auVar208._0_4_;
      auVar208._20_4_ = auVar208._0_4_;
      auVar208._24_4_ = auVar208._0_4_;
      auVar208._28_4_ = auVar208._0_4_;
      auVar96 = vmaxps_avx512vl(auVar208,auVar112);
      auVar81 = vsubss_avx512f(ZEXT416((uint)ray->tfar),local_610);
      auVar218._0_4_ = auVar81._0_4_;
      auVar218._4_4_ = auVar218._0_4_;
      auVar218._8_4_ = auVar218._0_4_;
      auVar218._12_4_ = auVar218._0_4_;
      auVar218._16_4_ = auVar218._0_4_;
      auVar218._20_4_ = auVar218._0_4_;
      auVar218._24_4_ = auVar218._0_4_;
      auVar218._28_4_ = auVar218._0_4_;
      auVar104 = vminps_avx512vl(auVar218,auVar113);
      auVar102 = vmulps_avx512vl(auVar46,auVar102);
      auVar101 = vfmadd213ps_avx512vl(auVar101,auVar45,auVar102);
      auVar88 = vfmadd213ps_avx512vl(auVar88,auVar44,auVar101);
      auVar66._4_4_ = uStack_4bc;
      auVar66._0_4_ = local_4c0;
      auVar66._8_4_ = uStack_4b8;
      auVar66._12_4_ = uStack_4b4;
      auVar66._16_4_ = uStack_4b0;
      auVar66._20_4_ = uStack_4ac;
      auVar66._24_4_ = uStack_4a8;
      auVar66._28_4_ = uStack_4a4;
      auVar101 = vmulps_avx512vl(auVar66,auVar46);
      auVar101 = vfmadd231ps_avx512vl(auVar101,local_4a0,auVar45);
      auVar101 = vfmadd231ps_avx512vl(auVar101,local_480,auVar44);
      auVar102 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar249 = ZEXT3264(auVar102);
      vandps_avx512vl(auVar101,auVar102);
      auVar108 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar102,auVar108,1);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar88 = vxorps_avx512vl(auVar88,auVar111);
      auVar109 = vrcp14ps_avx512vl(auVar101);
      auVar110 = vxorps_avx512vl(auVar101,auVar111);
      auVar114 = vfnmadd213ps_avx512vl(auVar109,auVar101,auVar207);
      auVar114 = vfmadd132ps_avx512vl(auVar114,auVar109,auVar109);
      auVar88 = vmulps_avx512vl(auVar114,auVar88);
      uVar17 = vcmpps_avx512vl(auVar101,auVar110,1);
      bVar73 = (byte)uVar16 | (byte)uVar17;
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar115 = vblendmps_avx512vl(auVar88,auVar114);
      auVar116._0_4_ =
           (uint)(bVar73 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar109._0_4_;
      bVar75 = (bool)(bVar73 >> 1 & 1);
      auVar116._4_4_ = (uint)bVar75 * auVar115._4_4_ | (uint)!bVar75 * auVar109._4_4_;
      bVar75 = (bool)(bVar73 >> 2 & 1);
      auVar116._8_4_ = (uint)bVar75 * auVar115._8_4_ | (uint)!bVar75 * auVar109._8_4_;
      bVar75 = (bool)(bVar73 >> 3 & 1);
      auVar116._12_4_ = (uint)bVar75 * auVar115._12_4_ | (uint)!bVar75 * auVar109._12_4_;
      bVar75 = (bool)(bVar73 >> 4 & 1);
      auVar116._16_4_ = (uint)bVar75 * auVar115._16_4_ | (uint)!bVar75 * auVar109._16_4_;
      bVar75 = (bool)(bVar73 >> 5 & 1);
      auVar116._20_4_ = (uint)bVar75 * auVar115._20_4_ | (uint)!bVar75 * auVar109._20_4_;
      bVar75 = (bool)(bVar73 >> 6 & 1);
      auVar116._24_4_ = (uint)bVar75 * auVar115._24_4_ | (uint)!bVar75 * auVar109._24_4_;
      auVar116._28_4_ =
           (uint)(bVar73 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar109._28_4_;
      auVar96 = vmaxps_avx(auVar96,auVar116);
      uVar17 = vcmpps_avx512vl(auVar101,auVar110,6);
      bVar73 = (byte)uVar16 | (byte)uVar17;
      auVar101 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar117._0_4_ =
           (uint)(bVar73 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar88._0_4_;
      bVar75 = (bool)(bVar73 >> 1 & 1);
      auVar117._4_4_ = (uint)bVar75 * auVar101._4_4_ | (uint)!bVar75 * auVar88._4_4_;
      bVar75 = (bool)(bVar73 >> 2 & 1);
      auVar117._8_4_ = (uint)bVar75 * auVar101._8_4_ | (uint)!bVar75 * auVar88._8_4_;
      bVar75 = (bool)(bVar73 >> 3 & 1);
      auVar117._12_4_ = (uint)bVar75 * auVar101._12_4_ | (uint)!bVar75 * auVar88._12_4_;
      bVar75 = (bool)(bVar73 >> 4 & 1);
      auVar117._16_4_ = (uint)bVar75 * auVar101._16_4_ | (uint)!bVar75 * auVar88._16_4_;
      bVar75 = (bool)(bVar73 >> 5 & 1);
      auVar117._20_4_ = (uint)bVar75 * auVar101._20_4_ | (uint)!bVar75 * auVar88._20_4_;
      bVar75 = (bool)(bVar73 >> 6 & 1);
      auVar117._24_4_ = (uint)bVar75 * auVar101._24_4_ | (uint)!bVar75 * auVar88._24_4_;
      auVar117._28_4_ =
           (uint)(bVar73 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar88._28_4_;
      auVar88 = vminps_avx(auVar104,auVar117);
      auVar248 = ZEXT864(0) << 0x20;
      auVar98 = vsubps_avx(ZEXT832(0) << 0x20,auVar98);
      auVar99 = vsubps_avx(ZEXT832(0) << 0x20,auVar99);
      auVar104 = ZEXT832(0) << 0x20;
      auVar100 = vsubps_avx(auVar104,auVar100);
      auVar51._4_4_ = auVar100._4_4_ * auVar87._4_4_;
      auVar51._0_4_ = auVar100._0_4_ * auVar87._0_4_;
      auVar51._8_4_ = auVar100._8_4_ * auVar87._8_4_;
      auVar51._12_4_ = auVar100._12_4_ * auVar87._12_4_;
      auVar51._16_4_ = auVar100._16_4_ * auVar87._16_4_;
      auVar51._20_4_ = auVar100._20_4_ * auVar87._20_4_;
      auVar51._24_4_ = auVar100._24_4_ * auVar87._24_4_;
      auVar51._28_4_ = auVar100._28_4_;
      auVar99 = vfnmsub231ps_avx512vl(auVar51,auVar86,auVar99);
      auVar98 = vfnmadd231ps_avx512vl(auVar99,auVar91,auVar98);
      auVar99 = vmulps_avx512vl(auVar66,auVar87);
      auVar99 = vfnmsub231ps_avx512vl(auVar99,local_4a0,auVar86);
      auVar99 = vfnmadd231ps_avx512vl(auVar99,local_480,auVar91);
      vandps_avx512vl(auVar99,auVar102);
      uVar16 = vcmpps_avx512vl(auVar99,auVar108,1);
      auVar98 = vxorps_avx512vl(auVar98,auVar111);
      auVar100 = vrcp14ps_avx512vl(auVar99);
      auVar91 = vxorps_avx512vl(auVar99,auVar111);
      auVar242 = ZEXT3264(auVar91);
      auVar87 = vfnmadd213ps_avx512vl(auVar100,auVar99,auVar207);
      auVar81 = vfmadd132ps_fma(auVar87,auVar100,auVar100);
      auVar246 = ZEXT1664(auVar81);
      fVar201 = auVar81._0_4_ * auVar98._0_4_;
      fVar233 = auVar81._4_4_ * auVar98._4_4_;
      auVar52._4_4_ = fVar233;
      auVar52._0_4_ = fVar201;
      fVar235 = auVar81._8_4_ * auVar98._8_4_;
      auVar52._8_4_ = fVar235;
      fVar237 = auVar81._12_4_ * auVar98._12_4_;
      auVar52._12_4_ = fVar237;
      fVar238 = auVar98._16_4_ * 0.0;
      auVar52._16_4_ = fVar238;
      fVar243 = auVar98._20_4_ * 0.0;
      auVar52._20_4_ = fVar243;
      fVar138 = auVar98._24_4_ * 0.0;
      auVar52._24_4_ = fVar138;
      auVar52._28_4_ = auVar98._28_4_;
      uVar17 = vcmpps_avx512vl(auVar99,auVar91,1);
      bVar73 = (byte)uVar16 | (byte)uVar17;
      auVar87 = vblendmps_avx512vl(auVar52,auVar114);
      auVar118._0_4_ =
           (uint)(bVar73 & 1) * auVar87._0_4_ | (uint)!(bool)(bVar73 & 1) * auVar100._0_4_;
      bVar75 = (bool)(bVar73 >> 1 & 1);
      auVar118._4_4_ = (uint)bVar75 * auVar87._4_4_ | (uint)!bVar75 * auVar100._4_4_;
      bVar75 = (bool)(bVar73 >> 2 & 1);
      auVar118._8_4_ = (uint)bVar75 * auVar87._8_4_ | (uint)!bVar75 * auVar100._8_4_;
      bVar75 = (bool)(bVar73 >> 3 & 1);
      auVar118._12_4_ = (uint)bVar75 * auVar87._12_4_ | (uint)!bVar75 * auVar100._12_4_;
      bVar75 = (bool)(bVar73 >> 4 & 1);
      auVar118._16_4_ = (uint)bVar75 * auVar87._16_4_ | (uint)!bVar75 * auVar100._16_4_;
      bVar75 = (bool)(bVar73 >> 5 & 1);
      auVar118._20_4_ = (uint)bVar75 * auVar87._20_4_ | (uint)!bVar75 * auVar100._20_4_;
      bVar75 = (bool)(bVar73 >> 6 & 1);
      auVar118._24_4_ = (uint)bVar75 * auVar87._24_4_ | (uint)!bVar75 * auVar100._24_4_;
      auVar118._28_4_ =
           (uint)(bVar73 >> 7) * auVar87._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar100._28_4_;
      auVar239 = ZEXT3264(auVar118);
      _local_5a0 = vmaxps_avx(auVar96,auVar118);
      uVar17 = vcmpps_avx512vl(auVar99,auVar91,6);
      bVar73 = (byte)uVar16 | (byte)uVar17;
      auVar119._0_4_ =
           (uint)(bVar73 & 1) * auVar101._0_4_ | (uint)!(bool)(bVar73 & 1) * (int)fVar201;
      bVar75 = (bool)(bVar73 >> 1 & 1);
      auVar119._4_4_ = (uint)bVar75 * auVar101._4_4_ | (uint)!bVar75 * (int)fVar233;
      bVar75 = (bool)(bVar73 >> 2 & 1);
      auVar119._8_4_ = (uint)bVar75 * auVar101._8_4_ | (uint)!bVar75 * (int)fVar235;
      bVar75 = (bool)(bVar73 >> 3 & 1);
      auVar119._12_4_ = (uint)bVar75 * auVar101._12_4_ | (uint)!bVar75 * (int)fVar237;
      bVar75 = (bool)(bVar73 >> 4 & 1);
      auVar119._16_4_ = (uint)bVar75 * auVar101._16_4_ | (uint)!bVar75 * (int)fVar238;
      bVar75 = (bool)(bVar73 >> 5 & 1);
      auVar119._20_4_ = (uint)bVar75 * auVar101._20_4_ | (uint)!bVar75 * (int)fVar243;
      bVar75 = (bool)(bVar73 >> 6 & 1);
      auVar119._24_4_ = (uint)bVar75 * auVar101._24_4_ | (uint)!bVar75 * (int)fVar138;
      auVar119._28_4_ =
           (uint)(bVar73 >> 7) * auVar101._28_4_ | (uint)!(bool)(bVar73 >> 7) * auVar98._28_4_;
      auVar231 = ZEXT3264(auVar119);
      local_400 = vminps_avx(auVar88,auVar119);
      auVar230 = ZEXT3264(local_400);
      uVar16 = vcmpps_avx512vl(_local_5a0,local_400,2);
      bVar71 = bVar71 & 0x7f & (byte)uVar16;
      if (bVar71 == 0) {
        auVar211 = ZEXT3264(auVar207);
      }
      else {
        auVar96 = vmaxps_avx(auVar104,local_8a0);
        auVar98 = vminps_avx512vl(local_520,auVar207);
        auVar58 = ZEXT412(0);
        auVar99 = ZEXT1232(auVar58) << 0x20;
        auVar98 = vmaxps_avx(auVar98,ZEXT1232(auVar58) << 0x20);
        auVar100 = vminps_avx512vl(local_540,auVar207);
        auVar246 = ZEXT3264(CONCAT428(0x3e000000,
                                      CONCAT424(0x3e000000,
                                                CONCAT420(0x3e000000,
                                                          CONCAT416(0x3e000000,
                                                                    CONCAT412(0x3e000000,
                                                                              CONCAT48(0x3e000000,
                                                                                                                                                                              
                                                  0x3e0000003e000000)))))));
        auVar53._4_4_ = (auVar98._4_4_ + 1.0) * 0.125;
        auVar53._0_4_ = (auVar98._0_4_ + 0.0) * 0.125;
        auVar53._8_4_ = (auVar98._8_4_ + 2.0) * 0.125;
        auVar53._12_4_ = (auVar98._12_4_ + 3.0) * 0.125;
        auVar53._16_4_ = (auVar98._16_4_ + 4.0) * 0.125;
        auVar53._20_4_ = (auVar98._20_4_ + 5.0) * 0.125;
        auVar53._24_4_ = (auVar98._24_4_ + 6.0) * 0.125;
        auVar53._28_4_ = auVar98._28_4_ + 7.0;
        auVar81 = vfmadd213ps_fma(auVar53,local_700,local_8c0);
        local_520 = ZEXT1632(auVar81);
        auVar98 = vmaxps_avx(auVar100,ZEXT1232(auVar58) << 0x20);
        auVar54._4_4_ = (auVar98._4_4_ + 1.0) * 0.125;
        auVar54._0_4_ = (auVar98._0_4_ + 0.0) * 0.125;
        auVar54._8_4_ = (auVar98._8_4_ + 2.0) * 0.125;
        auVar54._12_4_ = (auVar98._12_4_ + 3.0) * 0.125;
        auVar54._16_4_ = (auVar98._16_4_ + 4.0) * 0.125;
        auVar54._20_4_ = (auVar98._20_4_ + 5.0) * 0.125;
        auVar54._24_4_ = (auVar98._24_4_ + 6.0) * 0.125;
        auVar54._28_4_ = auVar98._28_4_ + 7.0;
        auVar81 = vfmadd213ps_fma(auVar54,local_700,local_8c0);
        local_540 = ZEXT1632(auVar81);
        auVar209._0_4_ = auVar96._0_4_ * auVar96._0_4_;
        auVar209._4_4_ = auVar96._4_4_ * auVar96._4_4_;
        auVar209._8_4_ = auVar96._8_4_ * auVar96._8_4_;
        auVar209._12_4_ = auVar96._12_4_ * auVar96._12_4_;
        auVar209._16_4_ = auVar96._16_4_ * auVar96._16_4_;
        auVar209._20_4_ = auVar96._20_4_ * auVar96._20_4_;
        auVar209._24_4_ = auVar96._24_4_ * auVar96._24_4_;
        auVar209._28_4_ = 0;
        auVar96 = vsubps_avx(local_7c0,auVar209);
        auVar98 = vmulps_avx512vl(auVar107,auVar96);
        auVar120 = vsubps_avx512vl(auVar106,auVar98);
        uVar16 = vcmpps_avx512vl(auVar120,ZEXT1232(auVar58) << 0x20,5);
        bVar73 = (byte)uVar16;
        if (bVar73 == 0) {
          auVar92 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar211 = ZEXT864(0) << 0x20;
          auVar98 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar100 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar231 = ZEXT864(0) << 0x20;
          auVar121._8_4_ = 0x7f800000;
          auVar121._0_8_ = 0x7f8000007f800000;
          auVar121._12_4_ = 0x7f800000;
          auVar121._16_4_ = 0x7f800000;
          auVar121._20_4_ = 0x7f800000;
          auVar121._24_4_ = 0x7f800000;
          auVar121._28_4_ = 0x7f800000;
          auVar122._8_4_ = 0xff800000;
          auVar122._0_8_ = 0xff800000ff800000;
          auVar122._12_4_ = 0xff800000;
          auVar122._16_4_ = 0xff800000;
          auVar122._20_4_ = 0xff800000;
          auVar122._24_4_ = 0xff800000;
          auVar122._28_4_ = 0xff800000;
        }
        else {
          auVar82 = vxorps_avx512vl(auVar86._0_16_,auVar86._0_16_);
          uVar77 = vcmpps_avx512vl(auVar120,auVar104,5);
          auVar98 = vsqrtps_avx(auVar120);
          auVar219._0_4_ = auVar90._0_4_ + auVar90._0_4_;
          auVar219._4_4_ = auVar90._4_4_ + auVar90._4_4_;
          auVar219._8_4_ = auVar90._8_4_ + auVar90._8_4_;
          auVar219._12_4_ = auVar90._12_4_ + auVar90._12_4_;
          auVar219._16_4_ = auVar90._16_4_ + auVar90._16_4_;
          auVar219._20_4_ = auVar90._20_4_ + auVar90._20_4_;
          auVar219._24_4_ = auVar90._24_4_ + auVar90._24_4_;
          auVar219._28_4_ = auVar90._28_4_ + auVar90._28_4_;
          auVar99 = vrcp14ps_avx512vl(auVar219);
          auVar100 = vfnmadd213ps_avx512vl(auVar219,auVar99,auVar207);
          auVar81 = vfmadd132ps_fma(auVar100,auVar99,auVar99);
          auVar25._8_4_ = 0x80000000;
          auVar25._0_8_ = 0x8000000080000000;
          auVar25._12_4_ = 0x80000000;
          auVar25._16_4_ = 0x80000000;
          auVar25._20_4_ = 0x80000000;
          auVar25._24_4_ = 0x80000000;
          auVar25._28_4_ = 0x80000000;
          auVar99 = vxorps_avx512vl(auVar103,auVar25);
          auVar99 = vsubps_avx(auVar99,auVar98);
          auVar55._4_4_ = auVar99._4_4_ * auVar81._4_4_;
          auVar55._0_4_ = auVar99._0_4_ * auVar81._0_4_;
          auVar55._8_4_ = auVar99._8_4_ * auVar81._8_4_;
          auVar55._12_4_ = auVar99._12_4_ * auVar81._12_4_;
          auVar55._16_4_ = auVar99._16_4_ * 0.0;
          auVar55._20_4_ = auVar99._20_4_ * 0.0;
          auVar55._24_4_ = auVar99._24_4_ * 0.0;
          auVar55._28_4_ = 0x3e000000;
          auVar246 = ZEXT3264(auVar55);
          auVar98 = vsubps_avx512vl(auVar98,auVar103);
          auVar247._0_4_ = auVar98._0_4_ * auVar81._0_4_;
          auVar247._4_4_ = auVar98._4_4_ * auVar81._4_4_;
          auVar247._8_4_ = auVar98._8_4_ * auVar81._8_4_;
          auVar247._12_4_ = auVar98._12_4_ * auVar81._12_4_;
          auVar247._16_4_ = auVar98._16_4_ * 0.0;
          auVar247._20_4_ = auVar98._20_4_ * 0.0;
          auVar247._24_4_ = auVar98._24_4_ * 0.0;
          auVar247._28_4_ = 0;
          auVar248 = ZEXT3264(auVar247);
          auVar98 = vfmadd213ps_avx512vl(auVar105,auVar55,auVar92);
          auVar56._4_4_ = auVar93._4_4_ * auVar98._4_4_;
          auVar56._0_4_ = auVar93._0_4_ * auVar98._0_4_;
          auVar56._8_4_ = auVar93._8_4_ * auVar98._8_4_;
          auVar56._12_4_ = auVar93._12_4_ * auVar98._12_4_;
          auVar56._16_4_ = auVar93._16_4_ * auVar98._16_4_;
          auVar56._20_4_ = auVar93._20_4_ * auVar98._20_4_;
          auVar56._24_4_ = auVar93._24_4_ * auVar98._24_4_;
          auVar56._28_4_ = auVar99._28_4_;
          auVar98 = vmulps_avx512vl(local_480,auVar55);
          auVar99 = vmulps_avx512vl(local_4a0,auVar55);
          auVar91 = vmulps_avx512vl(auVar66,auVar55);
          auVar100 = vfmadd213ps_avx512vl(auVar94,auVar56,auVar97);
          auVar98 = vsubps_avx512vl(auVar98,auVar100);
          auVar100 = vfmadd213ps_avx512vl(auVar89,auVar56,local_860);
          auVar100 = vsubps_avx512vl(auVar99,auVar100);
          auVar81 = vfmadd213ps_fma(auVar56,auVar95,local_720);
          auVar99 = vsubps_avx(auVar91,ZEXT1632(auVar81));
          auVar231 = ZEXT3264(auVar99);
          auVar92 = vfmadd213ps_avx512vl(auVar105,auVar247,auVar92);
          auVar93 = vmulps_avx512vl(auVar93,auVar92);
          auVar92 = vmulps_avx512vl(local_480,auVar247);
          auVar91 = vmulps_avx512vl(local_4a0,auVar247);
          auVar86 = vmulps_avx512vl(auVar66,auVar247);
          auVar81 = vfmadd213ps_fma(auVar94,auVar93,auVar97);
          auVar99 = vsubps_avx(auVar92,ZEXT1632(auVar81));
          auVar81 = vfmadd213ps_fma(auVar89,auVar93,local_860);
          auVar92 = vsubps_avx512vl(auVar91,ZEXT1632(auVar81));
          auVar81 = vfmadd213ps_fma(auVar95,auVar93,local_720);
          auVar93 = vsubps_avx512vl(auVar86,ZEXT1632(auVar81));
          auVar211 = ZEXT3264(auVar93);
          auVar145._8_4_ = 0x7f800000;
          auVar145._0_8_ = 0x7f8000007f800000;
          auVar145._12_4_ = 0x7f800000;
          auVar145._16_4_ = 0x7f800000;
          auVar145._20_4_ = 0x7f800000;
          auVar145._24_4_ = 0x7f800000;
          auVar145._28_4_ = 0x7f800000;
          auVar93 = vblendmps_avx512vl(auVar145,auVar55);
          bVar75 = (bool)((byte)uVar77 & 1);
          auVar121._0_4_ = (uint)bVar75 * auVar93._0_4_ | (uint)!bVar75 * auVar97._0_4_;
          bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar121._4_4_ = (uint)bVar75 * auVar93._4_4_ | (uint)!bVar75 * auVar97._4_4_;
          bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar121._8_4_ = (uint)bVar75 * auVar93._8_4_ | (uint)!bVar75 * auVar97._8_4_;
          bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar121._12_4_ = (uint)bVar75 * auVar93._12_4_ | (uint)!bVar75 * auVar97._12_4_;
          bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar121._16_4_ = (uint)bVar75 * auVar93._16_4_ | (uint)!bVar75 * auVar97._16_4_;
          bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar121._20_4_ = (uint)bVar75 * auVar93._20_4_ | (uint)!bVar75 * auVar97._20_4_;
          bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar121._24_4_ = (uint)bVar75 * auVar93._24_4_ | (uint)!bVar75 * auVar97._24_4_;
          bVar75 = SUB81(uVar77 >> 7,0);
          auVar121._28_4_ = (uint)bVar75 * auVar93._28_4_ | (uint)!bVar75 * auVar97._28_4_;
          auVar146._8_4_ = 0xff800000;
          auVar146._0_8_ = 0xff800000ff800000;
          auVar146._12_4_ = 0xff800000;
          auVar146._16_4_ = 0xff800000;
          auVar146._20_4_ = 0xff800000;
          auVar146._24_4_ = 0xff800000;
          auVar146._28_4_ = 0xff800000;
          auVar93 = vblendmps_avx512vl(auVar146,auVar247);
          bVar75 = (bool)((byte)uVar77 & 1);
          auVar122._0_4_ = (uint)bVar75 * auVar93._0_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
          auVar122._4_4_ = (uint)bVar75 * auVar93._4_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
          auVar122._8_4_ = (uint)bVar75 * auVar93._8_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
          auVar122._12_4_ = (uint)bVar75 * auVar93._12_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
          auVar122._16_4_ = (uint)bVar75 * auVar93._16_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
          auVar122._20_4_ = (uint)bVar75 * auVar93._20_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
          auVar122._24_4_ = (uint)bVar75 * auVar93._24_4_ | (uint)!bVar75 * -0x800000;
          bVar75 = SUB81(uVar77 >> 7,0);
          auVar122._28_4_ = (uint)bVar75 * auVar93._28_4_ | (uint)!bVar75 * -0x800000;
          vandps_avx512vl(auVar102,local_660);
          auVar93 = vmaxps_avx(local_4e0,auVar122);
          auVar26._8_4_ = 0x36000000;
          auVar26._0_8_ = 0x3600000036000000;
          auVar26._12_4_ = 0x36000000;
          auVar26._16_4_ = 0x36000000;
          auVar26._20_4_ = 0x36000000;
          auVar26._24_4_ = 0x36000000;
          auVar26._28_4_ = 0x36000000;
          auVar120 = vmulps_avx512vl(auVar93,auVar26);
          vandps_avx512vl(auVar90,auVar102);
          uVar72 = vcmpps_avx512vl(auVar120,auVar120,1);
          uVar77 = uVar77 & uVar72;
          bVar70 = (byte)uVar77;
          if (bVar70 != 0) {
            uVar72 = vcmpps_avx512vl(auVar96,ZEXT1632(auVar82),2);
            auVar226._8_4_ = 0xff800000;
            auVar226._0_8_ = 0xff800000ff800000;
            auVar226._12_4_ = 0xff800000;
            auVar226._16_4_ = 0xff800000;
            auVar226._20_4_ = 0xff800000;
            auVar226._24_4_ = 0xff800000;
            auVar226._28_4_ = 0xff800000;
            auVar241._8_4_ = 0x7f800000;
            auVar241._0_8_ = 0x7f8000007f800000;
            auVar241._12_4_ = 0x7f800000;
            auVar241._16_4_ = 0x7f800000;
            auVar241._20_4_ = 0x7f800000;
            auVar241._24_4_ = 0x7f800000;
            auVar241._28_4_ = 0x7f800000;
            auVar93 = vblendmps_avx512vl(auVar241,auVar226);
            bVar67 = (byte)uVar72;
            uVar78 = (uint)(bVar67 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar120._0_4_
            ;
            bVar75 = (bool)((byte)(uVar72 >> 1) & 1);
            uVar131 = (uint)bVar75 * auVar93._4_4_ | (uint)!bVar75 * auVar120._4_4_;
            bVar75 = (bool)((byte)(uVar72 >> 2) & 1);
            uVar132 = (uint)bVar75 * auVar93._8_4_ | (uint)!bVar75 * auVar120._8_4_;
            bVar75 = (bool)((byte)(uVar72 >> 3) & 1);
            uVar133 = (uint)bVar75 * auVar93._12_4_ | (uint)!bVar75 * auVar120._12_4_;
            bVar75 = (bool)((byte)(uVar72 >> 4) & 1);
            uVar134 = (uint)bVar75 * auVar93._16_4_ | (uint)!bVar75 * auVar120._16_4_;
            bVar75 = (bool)((byte)(uVar72 >> 5) & 1);
            uVar135 = (uint)bVar75 * auVar93._20_4_ | (uint)!bVar75 * auVar120._20_4_;
            bVar75 = (bool)((byte)(uVar72 >> 6) & 1);
            uVar136 = (uint)bVar75 * auVar93._24_4_ | (uint)!bVar75 * auVar120._24_4_;
            bVar75 = SUB81(uVar72 >> 7,0);
            uVar137 = (uint)bVar75 * auVar93._28_4_ | (uint)!bVar75 * auVar120._28_4_;
            auVar121._0_4_ = (bVar70 & 1) * uVar78 | !(bool)(bVar70 & 1) * auVar121._0_4_;
            bVar75 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar121._4_4_ = bVar75 * uVar131 | !bVar75 * auVar121._4_4_;
            bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar121._8_4_ = bVar75 * uVar132 | !bVar75 * auVar121._8_4_;
            bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar121._12_4_ = bVar75 * uVar133 | !bVar75 * auVar121._12_4_;
            bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar121._16_4_ = bVar75 * uVar134 | !bVar75 * auVar121._16_4_;
            bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar121._20_4_ = bVar75 * uVar135 | !bVar75 * auVar121._20_4_;
            bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar121._24_4_ = bVar75 * uVar136 | !bVar75 * auVar121._24_4_;
            bVar75 = SUB81(uVar77 >> 7,0);
            auVar121._28_4_ = bVar75 * uVar137 | !bVar75 * auVar121._28_4_;
            auVar93 = vblendmps_avx512vl(auVar226,auVar241);
            bVar75 = (bool)((byte)(uVar72 >> 1) & 1);
            bVar10 = (bool)((byte)(uVar72 >> 2) & 1);
            bVar11 = (bool)((byte)(uVar72 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar72 >> 4) & 1);
            bVar13 = (bool)((byte)(uVar72 >> 5) & 1);
            bVar14 = (bool)((byte)(uVar72 >> 6) & 1);
            bVar15 = SUB81(uVar72 >> 7,0);
            auVar120._0_4_ =
                 (uint)(bVar70 & 1) *
                 ((uint)(bVar67 & 1) * auVar93._0_4_ | !(bool)(bVar67 & 1) * uVar78) |
                 !(bool)(bVar70 & 1) * auVar122._0_4_;
            bVar9 = (bool)((byte)(uVar77 >> 1) & 1);
            auVar120._4_4_ =
                 (uint)bVar9 * ((uint)bVar75 * auVar93._4_4_ | !bVar75 * uVar131) |
                 !bVar9 * auVar122._4_4_;
            bVar75 = (bool)((byte)(uVar77 >> 2) & 1);
            auVar120._8_4_ =
                 (uint)bVar75 * ((uint)bVar10 * auVar93._8_4_ | !bVar10 * uVar132) |
                 !bVar75 * auVar122._8_4_;
            bVar75 = (bool)((byte)(uVar77 >> 3) & 1);
            auVar120._12_4_ =
                 (uint)bVar75 * ((uint)bVar11 * auVar93._12_4_ | !bVar11 * uVar133) |
                 !bVar75 * auVar122._12_4_;
            bVar75 = (bool)((byte)(uVar77 >> 4) & 1);
            auVar120._16_4_ =
                 (uint)bVar75 * ((uint)bVar12 * auVar93._16_4_ | !bVar12 * uVar134) |
                 !bVar75 * auVar122._16_4_;
            bVar75 = (bool)((byte)(uVar77 >> 5) & 1);
            auVar120._20_4_ =
                 (uint)bVar75 * ((uint)bVar13 * auVar93._20_4_ | !bVar13 * uVar135) |
                 !bVar75 * auVar122._20_4_;
            bVar75 = (bool)((byte)(uVar77 >> 6) & 1);
            auVar120._24_4_ =
                 (uint)bVar75 * ((uint)bVar14 * auVar93._24_4_ | !bVar14 * uVar136) |
                 !bVar75 * auVar122._24_4_;
            bVar75 = SUB81(uVar77 >> 7,0);
            auVar120._28_4_ =
                 (uint)bVar75 * ((uint)bVar15 * auVar93._28_4_ | !bVar15 * uVar137) |
                 !bVar75 * auVar122._28_4_;
            bVar73 = (~bVar70 | bVar67) & bVar73;
            auVar122 = auVar120;
          }
        }
        uVar228 = *(undefined4 *)&(ray->dir).field_0;
        auVar225._4_4_ = uVar228;
        auVar225._0_4_ = uVar228;
        auVar225._8_4_ = uVar228;
        auVar225._12_4_ = uVar228;
        auVar225._16_4_ = uVar228;
        auVar225._20_4_ = uVar228;
        auVar225._24_4_ = uVar228;
        auVar225._28_4_ = uVar228;
        uVar228 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        auVar227._4_4_ = uVar228;
        auVar227._0_4_ = uVar228;
        auVar227._8_4_ = uVar228;
        auVar227._12_4_ = uVar228;
        auVar227._16_4_ = uVar228;
        auVar227._20_4_ = uVar228;
        auVar227._24_4_ = uVar228;
        auVar227._28_4_ = uVar228;
        fVar201 = (ray->dir).field_0.m128[2];
        auVar242 = ZEXT3264(CONCAT428(fVar201,CONCAT424(fVar201,CONCAT420(fVar201,CONCAT416(fVar201,
                                                  CONCAT412(fVar201,CONCAT48(fVar201,CONCAT44(
                                                  fVar201,fVar201))))))));
        auVar223._0_4_ = fVar201 * auVar211._0_4_;
        auVar223._4_4_ = fVar201 * auVar211._4_4_;
        auVar223._8_4_ = fVar201 * auVar211._8_4_;
        auVar223._12_4_ = fVar201 * auVar211._12_4_;
        auVar223._16_4_ = fVar201 * auVar211._16_4_;
        auVar223._20_4_ = fVar201 * auVar211._20_4_;
        auVar223._28_36_ = auVar211._28_36_;
        auVar223._24_4_ = fVar201 * auVar211._24_4_;
        auVar81 = vfmadd231ps_fma(auVar223._0_32_,auVar227,auVar92);
        auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar225,auVar99);
        auVar239 = ZEXT3264(_local_5a0);
        _local_460 = _local_5a0;
        local_440 = vminps_avx(local_400,auVar121);
        vandps_avx512vl(ZEXT1632(auVar81),auVar102);
        _local_580 = vmaxps_avx(_local_5a0,auVar122);
        auVar223 = ZEXT3264(_local_580);
        _local_420 = _local_580;
        auVar147._8_4_ = 0x3e99999a;
        auVar147._0_8_ = 0x3e99999a3e99999a;
        auVar147._12_4_ = 0x3e99999a;
        auVar147._16_4_ = 0x3e99999a;
        auVar147._20_4_ = 0x3e99999a;
        auVar147._24_4_ = 0x3e99999a;
        auVar147._28_4_ = 0x3e99999a;
        uVar16 = vcmpps_avx512vl(auVar120,auVar147,1);
        local_7f4 = (undefined4)uVar16;
        uVar16 = vcmpps_avx512vl(_local_5a0,local_440,2);
        bVar70 = (byte)uVar16 & bVar71;
        uVar17 = vcmpps_avx512vl(_local_580,local_400,2);
        if ((bVar71 & ((byte)uVar17 | (byte)uVar16)) == 0) {
          auVar211 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
        }
        else {
          auVar57._4_4_ = auVar231._4_4_ * fVar201;
          auVar57._0_4_ = auVar231._0_4_ * fVar201;
          auVar57._8_4_ = auVar231._8_4_ * fVar201;
          auVar57._12_4_ = auVar231._12_4_ * fVar201;
          auVar57._16_4_ = auVar231._16_4_ * fVar201;
          auVar57._20_4_ = auVar231._20_4_ * fVar201;
          auVar57._24_4_ = auVar231._24_4_ * fVar201;
          auVar57._28_4_ = 0x3e99999a;
          auVar81 = vfmadd213ps_fma(auVar100,auVar227,auVar57);
          auVar81 = vfmadd213ps_fma(auVar98,auVar225,ZEXT1632(auVar81));
          vandps_avx512vl(ZEXT1632(auVar81),auVar102);
          uVar16 = vcmpps_avx512vl(auVar120,auVar147,1);
          local_7fc = (uint)(byte)~bVar73;
          bVar73 = (byte)uVar16 | ~bVar73;
          auVar148._8_4_ = 2;
          auVar148._0_8_ = 0x200000002;
          auVar148._12_4_ = 2;
          auVar148._16_4_ = 2;
          auVar148._20_4_ = 2;
          auVar148._24_4_ = 2;
          auVar148._28_4_ = 2;
          auVar27._8_4_ = 3;
          auVar27._0_8_ = 0x300000003;
          auVar27._12_4_ = 3;
          auVar27._16_4_ = 3;
          auVar27._20_4_ = 3;
          auVar27._24_4_ = 3;
          auVar27._28_4_ = 3;
          auVar92 = vpblendmd_avx512vl(auVar148,auVar27);
          local_3e0._0_4_ = (uint)(bVar73 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
          bVar75 = (bool)(bVar73 >> 1 & 1);
          local_3e0._4_4_ = (uint)bVar75 * auVar92._4_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar73 >> 2 & 1);
          local_3e0._8_4_ = (uint)bVar75 * auVar92._8_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar73 >> 3 & 1);
          local_3e0._12_4_ = (uint)bVar75 * auVar92._12_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar73 >> 4 & 1);
          local_3e0._16_4_ = (uint)bVar75 * auVar92._16_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar73 >> 5 & 1);
          local_3e0._20_4_ = (uint)bVar75 * auVar92._20_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar73 >> 6 & 1);
          local_3e0._24_4_ = (uint)bVar75 * auVar92._24_4_ | (uint)!bVar75 * 2;
          local_3e0._28_4_ = (uint)(bVar73 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2;
          local_500 = vpbroadcastd_avx512vl();
          uVar16 = vpcmpd_avx512vl(local_500,local_3e0,5);
          local_7f8 = (uint)bVar70;
          bVar70 = (byte)uVar16 & bVar70;
          if (bVar70 == 0) {
            auVar213._8_4_ = 0x7fffffff;
            auVar213._0_8_ = 0x7fffffff7fffffff;
            auVar213._12_4_ = 0x7fffffff;
          }
          else {
            auVar82 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar81 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar3 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar4 = vminps_avx(auVar82,auVar3);
            auVar82 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar3 = vmaxps_avx(auVar81,auVar82);
            auVar181._8_4_ = 0x7fffffff;
            auVar181._0_8_ = 0x7fffffff7fffffff;
            auVar181._12_4_ = 0x7fffffff;
            auVar81 = vandps_avx(auVar4,auVar181);
            auVar82 = vandps_avx(auVar3,auVar181);
            auVar81 = vmaxps_avx(auVar81,auVar82);
            auVar82 = vmovshdup_avx(auVar81);
            auVar82 = vmaxss_avx(auVar82,auVar81);
            auVar81 = vshufpd_avx(auVar81,auVar81,1);
            auVar81 = vmaxss_avx(auVar81,auVar82);
            fVar224 = auVar81._0_4_ * 1.9073486e-06;
            local_620 = vshufps_avx(auVar3,auVar3,0xff);
            local_560 = (float)local_5a0._0_4_ + (float)local_740._0_4_;
            fStack_55c = (float)local_5a0._4_4_ + (float)local_740._4_4_;
            fStack_558 = fStack_598 + fStack_738;
            fStack_554 = fStack_594 + fStack_734;
            fStack_550 = fStack_590 + fStack_730;
            fStack_54c = fStack_58c + fStack_72c;
            fStack_548 = fStack_588 + fStack_728;
            fStack_544 = fStack_584 + fStack_724;
            do {
              auVar94 = local_8a0;
              auVar149._8_4_ = 0x7f800000;
              auVar149._0_8_ = 0x7f8000007f800000;
              auVar149._12_4_ = 0x7f800000;
              auVar149._16_4_ = 0x7f800000;
              auVar149._20_4_ = 0x7f800000;
              auVar149._24_4_ = 0x7f800000;
              auVar149._28_4_ = 0x7f800000;
              auVar92 = vblendmps_avx512vl(auVar149,_local_5a0);
              auVar123._0_4_ =
                   (uint)(bVar70 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar70 & 1) * 0x7f800000;
              bVar75 = (bool)(bVar70 >> 1 & 1);
              auVar123._4_4_ = (uint)bVar75 * auVar92._4_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar70 >> 2 & 1);
              auVar123._8_4_ = (uint)bVar75 * auVar92._8_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar70 >> 3 & 1);
              auVar123._12_4_ = (uint)bVar75 * auVar92._12_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar70 >> 4 & 1);
              auVar123._16_4_ = (uint)bVar75 * auVar92._16_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar70 >> 5 & 1);
              auVar123._20_4_ = (uint)bVar75 * auVar92._20_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar70 >> 6 & 1);
              auVar123._24_4_ = (uint)bVar75 * auVar92._24_4_ | (uint)!bVar75 * 0x7f800000;
              auVar123._28_4_ =
                   (uint)(bVar70 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar70 >> 7) * 0x7f800000;
              auVar92 = vshufps_avx(auVar123,auVar123,0xb1);
              auVar92 = vminps_avx(auVar123,auVar92);
              auVar93 = vshufpd_avx(auVar92,auVar92,5);
              auVar92 = vminps_avx(auVar92,auVar93);
              auVar93 = vpermpd_avx2(auVar92,0x4e);
              auVar92 = vminps_avx(auVar92,auVar93);
              uVar16 = vcmpps_avx512vl(auVar123,auVar92,0);
              bVar67 = (byte)uVar16 & bVar70;
              bVar73 = bVar70;
              if (bVar67 != 0) {
                bVar73 = bVar67;
              }
              iVar19 = 0;
              for (uVar78 = (uint)bVar73; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              auVar239 = ZEXT464(*(uint *)(local_520 + (uint)(iVar19 << 2)));
              auVar230 = ZEXT464(*(uint *)(local_460 + (uint)(iVar19 << 2)));
              aVar1 = (ray->dir).field_0;
              local_660._0_16_ = (undefined1  [16])aVar1;
              auVar81 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              if (auVar81._0_4_ < 0.0) {
                local_8c0._0_16_ = ZEXT416(*(uint *)(local_520 + (uint)(iVar19 << 2)));
                local_860._0_16_ = ZEXT416(*(uint *)(local_460 + (uint)(iVar19 << 2)));
                local_8a0[1] = 0;
                local_8a0[0] = bVar70;
                local_8a0._2_30_ = auVar94._2_30_;
                fVar179 = sqrtf(auVar81._0_4_);
                bVar70 = local_8a0[0];
                auVar230 = ZEXT1664(local_860._0_16_);
                auVar239 = ZEXT1664(local_8c0._0_16_);
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                fVar179 = auVar81._0_4_;
              }
              lVar74 = 5;
              do {
                local_860._0_16_ = auVar230._0_16_;
                uVar228 = auVar230._0_4_;
                auVar139._4_4_ = uVar228;
                auVar139._0_4_ = uVar228;
                auVar139._8_4_ = uVar228;
                auVar139._12_4_ = uVar228;
                auVar81 = vfmadd132ps_fma(auVar139,ZEXT816(0) << 0x40,local_660._0_16_);
                fVar159 = auVar239._0_4_;
                fVar157 = 1.0 - fVar159;
                fVar236 = fVar157 * fVar157 * fVar157;
                fVar232 = fVar159 * fVar159;
                fVar161 = fVar159 * fVar232;
                auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar236),
                                          ZEXT416((uint)fVar161));
                fVar234 = fVar159 * fVar157;
                local_8a0._0_16_ = ZEXT416((uint)fVar157);
                auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar159 * fVar234 * 6.0)),
                                         ZEXT416((uint)(fVar234 * fVar157)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar161),
                                         ZEXT416((uint)fVar236));
                auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * fVar157 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar159 * fVar234)));
                fVar236 = fVar236 * 0.16666667;
                fVar157 = (auVar82._0_4_ + auVar4._0_4_) * 0.16666667;
                fVar159 = (auVar3._0_4_ + auVar79._0_4_) * 0.16666667;
                fVar161 = fVar161 * 0.16666667;
                auVar182._0_4_ = fVar161 * (float)local_6e0._0_4_;
                auVar182._4_4_ = fVar161 * (float)local_6e0._4_4_;
                auVar182._8_4_ = fVar161 * fStack_6d8;
                auVar182._12_4_ = fVar161 * fStack_6d4;
                auVar212._4_4_ = fVar159;
                auVar212._0_4_ = fVar159;
                auVar212._8_4_ = fVar159;
                auVar212._12_4_ = fVar159;
                auVar82 = vfmadd132ps_fma(auVar212,auVar182,local_6a0._0_16_);
                auVar183._4_4_ = fVar157;
                auVar183._0_4_ = fVar157;
                auVar183._8_4_ = fVar157;
                auVar183._12_4_ = fVar157;
                auVar82 = vfmadd132ps_fma(auVar183,auVar82,local_6c0._0_16_);
                auVar163._4_4_ = fVar236;
                auVar163._0_4_ = fVar236;
                auVar163._8_4_ = fVar236;
                auVar163._12_4_ = fVar236;
                local_5b0 = vfmadd132ps_fma(auVar163,auVar82,local_680._0_16_);
                auVar81 = vsubps_avx(auVar81,local_5b0);
                local_700._0_16_ = auVar81;
                auVar81 = vdpps_avx(auVar81,auVar81,0x7f);
                local_8c0._0_16_ = auVar239._0_16_;
                local_720._0_16_ = auVar81;
                if (auVar81._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar232;
                  auVar242._0_4_ = sqrtf(auVar81._0_4_);
                  auVar242._4_60_ = extraout_var;
                  auVar81 = auVar242._0_16_;
                  auVar82 = local_8c0._0_16_;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  local_7c0._0_4_ = fVar232;
                  auVar82 = auVar239._0_16_;
                }
                local_5c0 = local_8a0._0_4_;
                auVar3 = vfnmsub213ss_fma(auVar82,auVar82,ZEXT416((uint)(fVar234 * 4.0)));
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * 4.0)),local_8a0._0_16_,
                                          local_8a0._0_16_);
                fVar232 = local_5c0 * -local_5c0 * 0.5;
                fVar234 = auVar3._0_4_ * 0.5;
                fVar236 = auVar82._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar202._0_4_ = (float)local_7c0._0_4_ * (float)local_6e0._0_4_;
                auVar202._4_4_ = (float)local_7c0._0_4_ * (float)local_6e0._4_4_;
                auVar202._8_4_ = (float)local_7c0._0_4_ * fStack_6d8;
                auVar202._12_4_ = (float)local_7c0._0_4_ * fStack_6d4;
                auVar164._4_4_ = fVar236;
                auVar164._0_4_ = fVar236;
                auVar164._8_4_ = fVar236;
                auVar164._12_4_ = fVar236;
                auVar82 = vfmadd132ps_fma(auVar164,auVar202,local_6a0._0_16_);
                auVar184._4_4_ = fVar234;
                auVar184._0_4_ = fVar234;
                auVar184._8_4_ = fVar234;
                auVar184._12_4_ = fVar234;
                auVar82 = vfmadd132ps_fma(auVar184,auVar82,local_6c0._0_16_);
                auVar244._4_4_ = fVar232;
                auVar244._0_4_ = fVar232;
                auVar244._8_4_ = fVar232;
                auVar244._12_4_ = fVar232;
                local_7c0._0_16_ = vfmadd132ps_fma(auVar244,auVar82,local_680._0_16_);
                local_5d0 = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
                auVar59._12_4_ = 0;
                auVar59._0_12_ = ZEXT812(0);
                fVar232 = local_5d0._0_4_;
                local_820 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar232));
                fVar234 = local_820._0_4_;
                local_5e0 = vrcp14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar232));
                auVar82 = vfnmadd213ss_fma(local_5e0,local_5d0,ZEXT416(0x40000000));
                uVar78 = auVar81._0_4_;
                fStack_5bc = local_5c0;
                fStack_5b8 = local_5c0;
                fStack_5b4 = local_5c0;
                if (fVar232 < -fVar232) {
                  local_830._0_4_ = fVar232 * -0.5;
                  fVar236 = sqrtf(fVar232);
                  auVar81 = ZEXT416(uVar78);
                  fVar232 = (float)local_830._0_4_;
                  auVar3 = local_7c0._0_16_;
                }
                else {
                  auVar3 = vsqrtss_avx(local_5d0,local_5d0);
                  fVar236 = auVar3._0_4_;
                  fVar232 = fVar232 * -0.5;
                  auVar3 = local_7c0._0_16_;
                }
                fVar157 = local_820._0_4_;
                fVar232 = fVar234 * 1.5 + fVar232 * fVar157 * fVar157 * fVar157;
                local_820._0_4_ = auVar3._0_4_ * fVar232;
                local_820._4_4_ = auVar3._4_4_ * fVar232;
                local_820._8_4_ = auVar3._8_4_ * fVar232;
                local_820._12_4_ = auVar3._12_4_ * fVar232;
                auVar4 = vdpps_avx(local_700._0_16_,local_820,0x7f);
                fVar157 = auVar81._0_4_;
                auVar140._0_4_ = auVar4._0_4_ * auVar4._0_4_;
                auVar140._4_4_ = auVar4._4_4_ * auVar4._4_4_;
                auVar140._8_4_ = auVar4._8_4_ * auVar4._8_4_;
                auVar140._12_4_ = auVar4._12_4_ * auVar4._12_4_;
                auVar83 = vsubps_avx512vl(local_720._0_16_,auVar140);
                fVar234 = auVar83._0_4_;
                auVar165._4_12_ = ZEXT812(0) << 0x20;
                auVar165._0_4_ = fVar234;
                auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar165);
                auVar80 = vmulss_avx512f(auVar79,ZEXT416(0x3fc00000));
                auVar84 = vmulss_avx512f(auVar83,ZEXT416(0xbf000000));
                if (fVar234 < 0.0) {
                  local_830 = auVar4;
                  local_600 = fVar232;
                  fStack_5fc = fVar232;
                  fStack_5f8 = fVar232;
                  fStack_5f4 = fVar232;
                  local_5f0 = auVar79;
                  fVar234 = sqrtf(fVar234);
                  auVar84 = ZEXT416(auVar84._0_4_);
                  auVar80 = ZEXT416(auVar80._0_4_);
                  auVar81 = ZEXT416(uVar78);
                  auVar3 = local_7c0._0_16_;
                  auVar4 = local_830;
                  auVar79 = local_5f0;
                  fVar232 = local_600;
                  fVar159 = fStack_5fc;
                  fVar161 = fStack_5f8;
                  fVar201 = fStack_5f4;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  fVar234 = auVar83._0_4_;
                  fVar159 = fVar232;
                  fVar161 = fVar232;
                  fVar201 = fVar232;
                }
                auVar246 = ZEXT1664(auVar3);
                auVar231 = ZEXT1664(local_700._0_16_);
                auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar249 = ZEXT3264(auVar92);
                auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_8a0._0_16_,
                                         local_8c0._0_16_);
                auVar83 = vfmadd231ss_fma(local_8a0._0_16_,local_8c0._0_16_,
                                          SUB6416(ZEXT464(0xc0000000),0));
                fVar235 = local_8c0._0_4_;
                auVar185._0_4_ = fVar235 * (float)local_6e0._0_4_;
                auVar185._4_4_ = fVar235 * (float)local_6e0._4_4_;
                auVar185._8_4_ = fVar235 * fStack_6d8;
                auVar185._12_4_ = fVar235 * fStack_6d4;
                auVar203._0_4_ = auVar83._0_4_;
                auVar203._4_4_ = auVar203._0_4_;
                auVar203._8_4_ = auVar203._0_4_;
                auVar203._12_4_ = auVar203._0_4_;
                auVar83 = vfmadd132ps_fma(auVar203,auVar185,local_6a0._0_16_);
                auVar166._0_4_ = auVar5._0_4_;
                auVar166._4_4_ = auVar166._0_4_;
                auVar166._8_4_ = auVar166._0_4_;
                auVar166._12_4_ = auVar166._0_4_;
                auVar83 = vfmadd132ps_fma(auVar166,auVar83,local_6c0._0_16_);
                auVar61._4_4_ = fStack_5bc;
                auVar61._0_4_ = local_5c0;
                auVar61._8_4_ = fStack_5b8;
                auVar61._12_4_ = fStack_5b4;
                auVar83 = vfmadd132ps_fma(auVar61,auVar83,local_680._0_16_);
                auVar167._0_4_ = auVar83._0_4_ * (float)local_5d0._0_4_;
                auVar167._4_4_ = auVar83._4_4_ * (float)local_5d0._0_4_;
                auVar167._8_4_ = auVar83._8_4_ * (float)local_5d0._0_4_;
                auVar167._12_4_ = auVar83._12_4_ * (float)local_5d0._0_4_;
                auVar83 = vdpps_avx(auVar3,auVar83,0x7f);
                fVar233 = auVar83._0_4_;
                auVar186._0_4_ = auVar3._0_4_ * fVar233;
                auVar186._4_4_ = auVar3._4_4_ * fVar233;
                auVar186._8_4_ = auVar3._8_4_ * fVar233;
                auVar186._12_4_ = auVar3._12_4_ * fVar233;
                auVar5 = vsubps_avx(auVar167,auVar186);
                fVar233 = auVar82._0_4_ * (float)local_5e0._0_4_;
                auVar83 = vmaxss_avx(ZEXT416((uint)fVar224),
                                     ZEXT416((uint)((float)local_860._0_4_ * fVar179 * 1.9073486e-06
                                                   )));
                auVar20._8_4_ = 0x80000000;
                auVar20._0_8_ = 0x8000000080000000;
                auVar20._12_4_ = 0x80000000;
                auVar125._16_16_ = auVar92._16_16_;
                auVar85 = vxorps_avx512vl(auVar3,auVar20);
                auVar187._0_4_ = fVar232 * auVar5._0_4_ * fVar233;
                auVar187._4_4_ = fVar159 * auVar5._4_4_ * fVar233;
                auVar187._8_4_ = fVar161 * auVar5._8_4_ * fVar233;
                auVar187._12_4_ = fVar201 * auVar5._12_4_ * fVar233;
                auVar242 = ZEXT1664(local_820);
                auVar82 = vdpps_avx(auVar85,local_820,0x7f);
                auVar5 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar224),auVar83);
                auVar81 = vdpps_avx(local_700._0_16_,auVar187,0x7f);
                auVar5 = vfmadd213ss_fma(ZEXT416((uint)(fVar157 + 1.0)),
                                         ZEXT416((uint)(fVar224 / fVar236)),auVar5);
                auVar248 = ZEXT1664(auVar5);
                fVar232 = auVar82._0_4_ + auVar81._0_4_;
                auVar81 = vdpps_avx(local_660._0_16_,local_820,0x7f);
                auVar82 = vdpps_avx(local_700._0_16_,auVar85,0x7f);
                auVar84 = vmulss_avx512f(auVar84,auVar79);
                auVar85 = vaddss_avx512f(auVar80,ZEXT416((uint)(auVar84._0_4_ *
                                                               auVar79._0_4_ * auVar79._0_4_)));
                auVar79 = vdpps_avx(local_700._0_16_,local_660._0_16_,0x7f);
                auVar80 = vfnmadd231ss_fma(auVar82,auVar4,ZEXT416((uint)fVar232));
                auVar84 = vfnmadd231ss_fma(auVar79,auVar4,auVar81);
                auVar82 = vpermilps_avx(local_5b0,0xff);
                fVar234 = fVar234 - auVar82._0_4_;
                auVar82 = vshufps_avx(auVar3,auVar3,0xff);
                auVar79 = vfmsub213ss_fma(auVar80,auVar85,auVar82);
                fVar236 = auVar84._0_4_ * auVar85._0_4_;
                auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar79._0_4_)),
                                          ZEXT416((uint)fVar232),ZEXT416((uint)fVar236));
                fVar157 = auVar80._0_4_;
                fVar236 = auVar4._0_4_ * (fVar236 / fVar157) - fVar234 * (auVar81._0_4_ / fVar157);
                auVar223 = ZEXT464((uint)fVar236);
                fVar235 = fVar235 - fVar236;
                auVar239 = ZEXT464((uint)fVar235);
                fVar232 = (float)local_860._0_4_ -
                          (fVar234 * (fVar232 / fVar157) - auVar4._0_4_ * (auVar79._0_4_ / fVar157))
                ;
                auVar230 = ZEXT464((uint)fVar232);
                auVar213._8_4_ = 0x7fffffff;
                auVar213._0_8_ = 0x7fffffff7fffffff;
                auVar213._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx(auVar4,auVar213);
                bVar75 = true;
                if (auVar81._0_4_ < auVar5._0_4_) {
                  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ + auVar83._0_4_)),local_620,
                                           ZEXT416(0x36000000));
                  auVar81 = vandps_avx(ZEXT416((uint)fVar234),auVar213);
                  if (auVar81._0_4_ < auVar4._0_4_) {
                    fVar232 = fVar232 + (float)local_610._0_4_;
                    auVar230 = ZEXT464((uint)fVar232);
                    if ((ray->org).field_0.m128[3] <= fVar232) {
                      fVar234 = ray->tfar;
                      auVar223 = ZEXT464((uint)fVar234);
                      if (((fVar232 <= fVar234) && (0.0 <= fVar235)) && (fVar235 <= 1.0)) {
                        auVar125._0_16_ = ZEXT816(0) << 0x20;
                        auVar124._4_28_ = auVar125._4_28_;
                        auVar124._0_4_ = local_720._0_4_;
                        auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar124._0_16_);
                        fVar236 = auVar81._0_4_;
                        auVar81 = vmulss_avx512f(local_720._0_16_,ZEXT416(0xbf000000));
                        pGVar7 = (context->scene->geometries).items[local_868].ptr;
                        if ((pGVar7->mask & ray->mask) != 0) {
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                            unaff_R13 = 1;
                          }
                          else {
                            fVar236 = fVar236 * 1.5 + auVar81._0_4_ * fVar236 * fVar236 * fVar236;
                            auVar168._0_4_ = local_700._0_4_ * fVar236;
                            auVar168._4_4_ = local_700._4_4_ * fVar236;
                            auVar168._8_4_ = local_700._8_4_ * fVar236;
                            auVar168._12_4_ = local_700._12_4_ * fVar236;
                            auVar79 = vfmadd213ps_fma(auVar82,auVar168,auVar3);
                            auVar81 = vshufps_avx(auVar168,auVar168,0xc9);
                            auVar82 = vshufps_avx(auVar3,auVar3,0xc9);
                            auVar169._0_4_ = auVar168._0_4_ * auVar82._0_4_;
                            auVar169._4_4_ = auVar168._4_4_ * auVar82._4_4_;
                            auVar169._8_4_ = auVar168._8_4_ * auVar82._8_4_;
                            auVar169._12_4_ = auVar168._12_4_ * auVar82._12_4_;
                            auVar4 = vfmsub231ps_fma(auVar169,auVar3,auVar81);
                            auVar81 = vshufps_avx(auVar4,auVar4,0xc9);
                            auVar82 = vshufps_avx(auVar79,auVar79,0xc9);
                            auVar4 = vshufps_avx(auVar4,auVar4,0xd2);
                            auVar141._0_4_ = auVar79._0_4_ * auVar4._0_4_;
                            auVar141._4_4_ = auVar79._4_4_ * auVar4._4_4_;
                            auVar141._8_4_ = auVar79._8_4_ * auVar4._8_4_;
                            auVar141._12_4_ = auVar79._12_4_ * auVar4._12_4_;
                            auVar82 = vfmsub231ps_fma(auVar141,auVar81,auVar82);
                            auVar81 = vshufps_avx(auVar82,auVar82,0xe9);
                            local_790 = vmovlps_avx(auVar81);
                            local_788 = auVar82._0_4_;
                            local_780 = 0;
                            local_77c = (undefined4)local_870;
                            local_778 = (undefined4)local_868;
                            local_774 = context->user->instID[0];
                            local_770 = context->user->instPrimID[0];
                            ray->tfar = fVar232;
                            local_8c4 = -1;
                            local_7f0.valid = &local_8c4;
                            local_7f0.geometryUserPtr = pGVar7->userPtr;
                            local_7f0.context = context->user;
                            local_7f0.hit = (RTCHitN *)&local_790;
                            local_7f0.N = 1;
                            local_8c0._0_16_ = ZEXT416((uint)fVar235);
                            local_860._0_16_ = ZEXT416((uint)fVar232);
                            local_8a0._0_4_ = fVar234;
                            local_7f0.ray = (RTCRayN *)ray;
                            local_784 = fVar235;
                            if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01e06f96:
                              p_Var8 = context->args->filter;
                              if (p_Var8 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                                  auVar231 = ZEXT1664(auVar231._0_16_);
                                  auVar242 = ZEXT1664(auVar242._0_16_);
                                  auVar246 = ZEXT1664(auVar246._0_16_);
                                  auVar248 = ZEXT1664(auVar248._0_16_);
                                  (*p_Var8)(&local_7f0);
                                  auVar223 = ZEXT464((uint)local_8a0._0_4_);
                                  auVar230 = ZEXT1664(local_860._0_16_);
                                  auVar239 = ZEXT1664(local_8c0._0_16_);
                                  auVar213._8_4_ = 0x7fffffff;
                                  auVar213._0_8_ = 0x7fffffff7fffffff;
                                  auVar213._12_4_ = 0x7fffffff;
                                  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar249 = ZEXT3264(auVar92);
                                }
                                if (*local_7f0.valid == 0) goto LAB_01e06ffb;
                              }
                              unaff_R13 = 1;
                            }
                            else {
                              auVar231 = ZEXT1664(local_700._0_16_);
                              auVar242 = ZEXT1664(local_820);
                              auVar246 = ZEXT1664(auVar3);
                              auVar248 = ZEXT1664(auVar5);
                              (*pGVar7->occlusionFilterN)(&local_7f0);
                              auVar223 = ZEXT464((uint)local_8a0._0_4_);
                              auVar230 = ZEXT1664(local_860._0_16_);
                              auVar239 = ZEXT1664(local_8c0._0_16_);
                              auVar213._8_4_ = 0x7fffffff;
                              auVar213._0_8_ = 0x7fffffff7fffffff;
                              auVar213._12_4_ = 0x7fffffff;
                              auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar249 = ZEXT3264(auVar92);
                              if (*local_7f0.valid != 0) goto LAB_01e06f96;
LAB_01e06ffb:
                              unaff_R13 = 0;
                            }
                            if ((char)unaff_R13 == '\0') {
                              ray->tfar = auVar223._0_4_;
                            }
                          }
                          bVar75 = false;
                          goto LAB_01e06e1b;
                        }
                      }
                    }
                    bVar75 = false;
                    unaff_R13 = 0;
                  }
                }
LAB_01e06e1b:
                bVar73 = (byte)unaff_R13;
                if (!bVar75) goto LAB_01e0701e;
                lVar74 = lVar74 + -1;
              } while (lVar74 != 0);
              bVar73 = 0;
              auVar213._8_4_ = 0x7fffffff;
              auVar213._0_8_ = 0x7fffffff7fffffff;
              auVar213._12_4_ = 0x7fffffff;
LAB_01e0701e:
              unaff_R13 = (ulong)(bVar73 & 1);
              bVar69 = bVar69 | bVar73 & 1;
              auVar63._4_4_ = fStack_55c;
              auVar63._0_4_ = local_560;
              auVar63._8_4_ = fStack_558;
              auVar63._12_4_ = fStack_554;
              auVar63._16_4_ = fStack_550;
              auVar63._20_4_ = fStack_54c;
              auVar63._24_4_ = fStack_548;
              auVar63._28_4_ = fStack_544;
              fVar179 = ray->tfar;
              auVar28._4_4_ = fVar179;
              auVar28._0_4_ = fVar179;
              auVar28._8_4_ = fVar179;
              auVar28._12_4_ = fVar179;
              auVar28._16_4_ = fVar179;
              auVar28._20_4_ = fVar179;
              auVar28._24_4_ = fVar179;
              auVar28._28_4_ = fVar179;
              uVar16 = vcmpps_avx512vl(auVar63,auVar28,2);
              bVar70 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar70 & (byte)uVar16;
            } while (bVar70 != 0);
          }
          auVar150._0_4_ = (float)local_740._0_4_ + (float)local_580._0_4_;
          auVar150._4_4_ = (float)local_740._4_4_ + (float)local_580._4_4_;
          auVar150._8_4_ = fStack_738 + fStack_578;
          auVar150._12_4_ = fStack_734 + fStack_574;
          auVar150._16_4_ = fStack_730 + fStack_570;
          auVar150._20_4_ = fStack_72c + fStack_56c;
          auVar150._24_4_ = fStack_728 + fStack_568;
          auVar150._28_4_ = fStack_724 + fStack_564;
          fVar224 = ray->tfar;
          auVar29._4_4_ = fVar224;
          auVar29._0_4_ = fVar224;
          auVar29._8_4_ = fVar224;
          auVar29._12_4_ = fVar224;
          auVar29._16_4_ = fVar224;
          auVar29._20_4_ = fVar224;
          auVar29._24_4_ = fVar224;
          auVar29._28_4_ = fVar224;
          uVar16 = vcmpps_avx512vl(auVar150,auVar29,2);
          bVar73 = (byte)local_7f4 | (byte)local_7fc;
          bVar71 = (byte)uVar17 & bVar71 & (byte)uVar16;
          auVar151._8_4_ = 2;
          auVar151._0_8_ = 0x200000002;
          auVar151._12_4_ = 2;
          auVar151._16_4_ = 2;
          auVar151._20_4_ = 2;
          auVar151._24_4_ = 2;
          auVar151._28_4_ = 2;
          auVar30._8_4_ = 3;
          auVar30._0_8_ = 0x300000003;
          auVar30._12_4_ = 3;
          auVar30._16_4_ = 3;
          auVar30._20_4_ = 3;
          auVar30._24_4_ = 3;
          auVar30._28_4_ = 3;
          auVar92 = vpblendmd_avx512vl(auVar151,auVar30);
          local_580._0_4_ = (uint)(bVar73 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar73 & 1) * 2;
          bVar75 = (bool)(bVar73 >> 1 & 1);
          local_580._4_4_ = (uint)bVar75 * auVar92._4_4_ | (uint)!bVar75 * 2;
          bVar75 = (bool)(bVar73 >> 2 & 1);
          fStack_578 = (float)((uint)bVar75 * auVar92._8_4_ | (uint)!bVar75 * 2);
          bVar75 = (bool)(bVar73 >> 3 & 1);
          fStack_574 = (float)((uint)bVar75 * auVar92._12_4_ | (uint)!bVar75 * 2);
          bVar75 = (bool)(bVar73 >> 4 & 1);
          fStack_570 = (float)((uint)bVar75 * auVar92._16_4_ | (uint)!bVar75 * 2);
          bVar75 = (bool)(bVar73 >> 5 & 1);
          fStack_56c = (float)((uint)bVar75 * auVar92._20_4_ | (uint)!bVar75 * 2);
          bVar75 = (bool)(bVar73 >> 6 & 1);
          fStack_568 = (float)((uint)bVar75 * auVar92._24_4_ | (uint)!bVar75 * 2);
          fStack_564 = (float)((uint)(bVar73 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar73 >> 7) * 2
                              );
          uVar16 = vpcmpd_avx512vl(_local_580,local_500,2);
          bVar73 = (byte)uVar16 & bVar71;
          fVar224 = (float)local_740._0_4_;
          fVar179 = (float)local_740._4_4_;
          fVar232 = fStack_738;
          fVar234 = fStack_734;
          fVar236 = fStack_730;
          fVar157 = fStack_72c;
          fVar159 = fStack_728;
          fVar161 = fStack_724;
          if (bVar73 != 0) {
            auVar82 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar81 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar3 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar4 = vminps_avx(auVar82,auVar3);
            auVar82 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar3 = vmaxps_avx(auVar81,auVar82);
            auVar81 = vandps_avx(auVar4,auVar213);
            auVar82 = vandps_avx(auVar3,auVar213);
            auVar81 = vmaxps_avx(auVar81,auVar82);
            auVar82 = vmovshdup_avx(auVar81);
            auVar82 = vmaxss_avx(auVar82,auVar81);
            auVar81 = vshufpd_avx(auVar81,auVar81,1);
            auVar81 = vmaxss_avx(auVar81,auVar82);
            fVar201 = auVar81._0_4_ * 1.9073486e-06;
            local_620 = vshufps_avx(auVar3,auVar3,0xff);
            _local_5a0 = _local_420;
            local_560 = (float)local_740._0_4_ + (float)local_420._0_4_;
            fStack_55c = (float)local_740._4_4_ + (float)local_420._4_4_;
            fStack_558 = fStack_738 + fStack_418;
            fStack_554 = fStack_734 + fStack_414;
            fStack_550 = fStack_730 + fStack_410;
            fStack_54c = fStack_72c + fStack_40c;
            fStack_548 = fStack_728 + fStack_408;
            fStack_544 = fStack_724 + fStack_404;
            do {
              auVar94 = local_8a0;
              auVar152._8_4_ = 0x7f800000;
              auVar152._0_8_ = 0x7f8000007f800000;
              auVar152._12_4_ = 0x7f800000;
              auVar152._16_4_ = 0x7f800000;
              auVar152._20_4_ = 0x7f800000;
              auVar152._24_4_ = 0x7f800000;
              auVar152._28_4_ = 0x7f800000;
              auVar92 = vblendmps_avx512vl(auVar152,_local_5a0);
              auVar126._0_4_ =
                   (uint)(bVar73 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar73 & 1) * 0x7f800000;
              bVar75 = (bool)(bVar73 >> 1 & 1);
              auVar126._4_4_ = (uint)bVar75 * auVar92._4_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar73 >> 2 & 1);
              auVar126._8_4_ = (uint)bVar75 * auVar92._8_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar73 >> 3 & 1);
              auVar126._12_4_ = (uint)bVar75 * auVar92._12_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar73 >> 4 & 1);
              auVar126._16_4_ = (uint)bVar75 * auVar92._16_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar73 >> 5 & 1);
              auVar126._20_4_ = (uint)bVar75 * auVar92._20_4_ | (uint)!bVar75 * 0x7f800000;
              bVar75 = (bool)(bVar73 >> 6 & 1);
              auVar126._24_4_ = (uint)bVar75 * auVar92._24_4_ | (uint)!bVar75 * 0x7f800000;
              auVar126._28_4_ =
                   (uint)(bVar73 >> 7) * auVar92._28_4_ | (uint)!(bool)(bVar73 >> 7) * 0x7f800000;
              auVar92 = vshufps_avx(auVar126,auVar126,0xb1);
              auVar92 = vminps_avx(auVar126,auVar92);
              auVar93 = vshufpd_avx(auVar92,auVar92,5);
              auVar92 = vminps_avx(auVar92,auVar93);
              auVar93 = vpermpd_avx2(auVar92,0x4e);
              auVar92 = vminps_avx(auVar92,auVar93);
              uVar16 = vcmpps_avx512vl(auVar126,auVar92,0);
              bVar67 = (byte)uVar16 & bVar73;
              bVar70 = bVar73;
              if (bVar67 != 0) {
                bVar70 = bVar67;
              }
              iVar19 = 0;
              for (uVar78 = (uint)bVar70; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              auVar239 = ZEXT464(*(uint *)(local_540 + (uint)(iVar19 << 2)));
              auVar230 = ZEXT464(*(uint *)(local_400 + (uint)(iVar19 << 2)));
              aVar1 = (ray->dir).field_0;
              local_660._0_16_ = (undefined1  [16])aVar1;
              auVar81 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              if (auVar81._0_4_ < 0.0) {
                local_8c0._0_16_ = ZEXT416(*(uint *)(local_540 + (uint)(iVar19 << 2)));
                local_860._0_16_ = ZEXT416(*(uint *)(local_400 + (uint)(iVar19 << 2)));
                local_8a0[1] = 0;
                local_8a0[0] = bVar73;
                local_8a0._2_30_ = auVar94._2_30_;
                fVar233 = sqrtf(auVar81._0_4_);
                bVar73 = local_8a0[0];
                auVar230 = ZEXT1664(local_860._0_16_);
                auVar239 = ZEXT1664(local_8c0._0_16_);
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                fVar233 = auVar81._0_4_;
              }
              lVar74 = 5;
              do {
                local_860._0_16_ = auVar230._0_16_;
                uVar228 = auVar230._0_4_;
                auVar142._4_4_ = uVar228;
                auVar142._0_4_ = uVar228;
                auVar142._8_4_ = uVar228;
                auVar142._12_4_ = uVar228;
                auVar81 = vfmadd132ps_fma(auVar142,ZEXT816(0) << 0x40,local_660._0_16_);
                fVar236 = auVar239._0_4_;
                fVar234 = 1.0 - fVar236;
                fVar232 = fVar234 * fVar234 * fVar234;
                fVar224 = fVar236 * fVar236;
                fVar157 = fVar236 * fVar224;
                auVar82 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar232),
                                          ZEXT416((uint)fVar157));
                fVar179 = fVar236 * fVar234;
                local_8a0._0_16_ = ZEXT416((uint)fVar234);
                auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar179 * 6.0)),
                                         ZEXT416((uint)(fVar179 * fVar234)),
                                         SUB6416(ZEXT464(0x41400000),0));
                auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar157),
                                         ZEXT416((uint)fVar232));
                auVar79 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * fVar234 * 6.0)),
                                          SUB6416(ZEXT464(0x41400000),0),
                                          ZEXT416((uint)(fVar236 * fVar179)));
                fVar232 = fVar232 * 0.16666667;
                fVar234 = (auVar82._0_4_ + auVar4._0_4_) * 0.16666667;
                fVar236 = (auVar3._0_4_ + auVar79._0_4_) * 0.16666667;
                fVar157 = fVar157 * 0.16666667;
                auVar188._0_4_ = fVar157 * (float)local_6e0._0_4_;
                auVar188._4_4_ = fVar157 * (float)local_6e0._4_4_;
                auVar188._8_4_ = fVar157 * fStack_6d8;
                auVar188._12_4_ = fVar157 * fStack_6d4;
                auVar214._4_4_ = fVar236;
                auVar214._0_4_ = fVar236;
                auVar214._8_4_ = fVar236;
                auVar214._12_4_ = fVar236;
                auVar82 = vfmadd132ps_fma(auVar214,auVar188,local_6a0._0_16_);
                auVar189._4_4_ = fVar234;
                auVar189._0_4_ = fVar234;
                auVar189._8_4_ = fVar234;
                auVar189._12_4_ = fVar234;
                auVar82 = vfmadd132ps_fma(auVar189,auVar82,local_6c0._0_16_);
                auVar170._4_4_ = fVar232;
                auVar170._0_4_ = fVar232;
                auVar170._8_4_ = fVar232;
                auVar170._12_4_ = fVar232;
                local_5b0 = vfmadd132ps_fma(auVar170,auVar82,local_680._0_16_);
                auVar81 = vsubps_avx(auVar81,local_5b0);
                local_700._0_16_ = auVar81;
                auVar81 = vdpps_avx(auVar81,auVar81,0x7f);
                local_8c0._0_16_ = auVar239._0_16_;
                local_720._0_16_ = auVar81;
                if (auVar81._0_4_ < 0.0) {
                  local_7c0._0_4_ = fVar224;
                  auVar246._0_4_ = sqrtf(auVar81._0_4_);
                  auVar246._4_60_ = extraout_var_00;
                  auVar81 = auVar246._0_16_;
                  auVar82 = local_8c0._0_16_;
                }
                else {
                  auVar81 = vsqrtss_avx(auVar81,auVar81);
                  local_7c0._0_4_ = fVar224;
                  auVar82 = auVar239._0_16_;
                }
                local_5c0 = local_8a0._0_4_;
                auVar3 = vfnmsub213ss_fma(auVar82,auVar82,ZEXT416((uint)(fVar179 * 4.0)));
                auVar82 = vfmadd231ss_fma(ZEXT416((uint)(fVar179 * 4.0)),local_8a0._0_16_,
                                          local_8a0._0_16_);
                fVar224 = local_5c0 * -local_5c0 * 0.5;
                fVar179 = auVar3._0_4_ * 0.5;
                fVar232 = auVar82._0_4_ * 0.5;
                local_7c0._0_4_ = (float)local_7c0._0_4_ * 0.5;
                auVar204._0_4_ = (float)local_7c0._0_4_ * (float)local_6e0._0_4_;
                auVar204._4_4_ = (float)local_7c0._0_4_ * (float)local_6e0._4_4_;
                auVar204._8_4_ = (float)local_7c0._0_4_ * fStack_6d8;
                auVar204._12_4_ = (float)local_7c0._0_4_ * fStack_6d4;
                auVar171._4_4_ = fVar232;
                auVar171._0_4_ = fVar232;
                auVar171._8_4_ = fVar232;
                auVar171._12_4_ = fVar232;
                auVar82 = vfmadd132ps_fma(auVar171,auVar204,local_6a0._0_16_);
                auVar190._4_4_ = fVar179;
                auVar190._0_4_ = fVar179;
                auVar190._8_4_ = fVar179;
                auVar190._12_4_ = fVar179;
                auVar82 = vfmadd132ps_fma(auVar190,auVar82,local_6c0._0_16_);
                auVar245._4_4_ = fVar224;
                auVar245._0_4_ = fVar224;
                auVar245._8_4_ = fVar224;
                auVar245._12_4_ = fVar224;
                local_7c0._0_16_ = vfmadd132ps_fma(auVar245,auVar82,local_680._0_16_);
                local_5d0 = vdpps_avx(local_7c0._0_16_,local_7c0._0_16_,0x7f);
                auVar60._12_4_ = 0;
                auVar60._0_12_ = ZEXT812(0);
                fVar224 = local_5d0._0_4_;
                local_820 = vrsqrt14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar224));
                fVar179 = local_820._0_4_;
                local_5e0 = vrcp14ss_avx512f(auVar60 << 0x20,ZEXT416((uint)fVar224));
                auVar82 = vfnmadd213ss_fma(local_5e0,local_5d0,ZEXT416(0x40000000));
                uVar78 = auVar81._0_4_;
                fStack_5bc = local_5c0;
                fStack_5b8 = local_5c0;
                fStack_5b4 = local_5c0;
                if (fVar224 < -fVar224) {
                  local_830._0_4_ = fVar224 * -0.5;
                  fVar232 = sqrtf(fVar224);
                  auVar81 = ZEXT416(uVar78);
                  fVar224 = (float)local_830._0_4_;
                  auVar3 = local_7c0._0_16_;
                }
                else {
                  auVar3 = vsqrtss_avx(local_5d0,local_5d0);
                  fVar232 = auVar3._0_4_;
                  fVar224 = fVar224 * -0.5;
                  auVar3 = local_7c0._0_16_;
                }
                fVar234 = local_820._0_4_;
                fVar224 = fVar179 * 1.5 + fVar224 * fVar234 * fVar234 * fVar234;
                local_820._0_4_ = auVar3._0_4_ * fVar224;
                local_820._4_4_ = auVar3._4_4_ * fVar224;
                local_820._8_4_ = auVar3._8_4_ * fVar224;
                local_820._12_4_ = auVar3._12_4_ * fVar224;
                auVar4 = vdpps_avx(local_700._0_16_,local_820,0x7f);
                fVar234 = auVar81._0_4_;
                auVar143._0_4_ = auVar4._0_4_ * auVar4._0_4_;
                auVar143._4_4_ = auVar4._4_4_ * auVar4._4_4_;
                auVar143._8_4_ = auVar4._8_4_ * auVar4._8_4_;
                auVar143._12_4_ = auVar4._12_4_ * auVar4._12_4_;
                auVar83 = vsubps_avx512vl(local_720._0_16_,auVar143);
                fVar179 = auVar83._0_4_;
                auVar172._4_12_ = ZEXT812(0) << 0x20;
                auVar172._0_4_ = fVar179;
                auVar79 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar172);
                auVar80 = vmulss_avx512f(auVar79,ZEXT416(0x3fc00000));
                auVar84 = vmulss_avx512f(auVar83,ZEXT416(0xbf000000));
                if (fVar179 < 0.0) {
                  local_830 = auVar4;
                  local_600 = fVar224;
                  fStack_5fc = fVar224;
                  fStack_5f8 = fVar224;
                  fStack_5f4 = fVar224;
                  local_5f0 = auVar79;
                  fVar235 = sqrtf(fVar179);
                  auVar84 = ZEXT416(auVar84._0_4_);
                  auVar80 = ZEXT416(auVar80._0_4_);
                  auVar81 = ZEXT416(uVar78);
                  auVar3 = local_7c0._0_16_;
                  auVar4 = local_830;
                  auVar79 = local_5f0;
                  fVar224 = local_600;
                  fVar179 = fStack_5fc;
                  fVar236 = fStack_5f8;
                  fVar157 = fStack_5f4;
                }
                else {
                  auVar83 = vsqrtss_avx(auVar83,auVar83);
                  fVar235 = auVar83._0_4_;
                  fVar179 = fVar224;
                  fVar236 = fVar224;
                  fVar157 = fVar224;
                }
                auVar246 = ZEXT1664(auVar3);
                auVar231 = ZEXT1664(local_700._0_16_);
                auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar249 = ZEXT3264(auVar92);
                auVar5 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_8a0._0_16_,
                                         local_8c0._0_16_);
                auVar83 = vfmadd231ss_fma(local_8a0._0_16_,local_8c0._0_16_,
                                          SUB6416(ZEXT464(0xc0000000),0));
                fVar238 = local_8c0._0_4_;
                auVar191._0_4_ = fVar238 * (float)local_6e0._0_4_;
                auVar191._4_4_ = fVar238 * (float)local_6e0._4_4_;
                auVar191._8_4_ = fVar238 * fStack_6d8;
                auVar191._12_4_ = fVar238 * fStack_6d4;
                auVar205._0_4_ = auVar83._0_4_;
                auVar205._4_4_ = auVar205._0_4_;
                auVar205._8_4_ = auVar205._0_4_;
                auVar205._12_4_ = auVar205._0_4_;
                auVar83 = vfmadd132ps_fma(auVar205,auVar191,local_6a0._0_16_);
                auVar173._0_4_ = auVar5._0_4_;
                auVar173._4_4_ = auVar173._0_4_;
                auVar173._8_4_ = auVar173._0_4_;
                auVar173._12_4_ = auVar173._0_4_;
                auVar83 = vfmadd132ps_fma(auVar173,auVar83,local_6c0._0_16_);
                auVar62._4_4_ = fStack_5bc;
                auVar62._0_4_ = local_5c0;
                auVar62._8_4_ = fStack_5b8;
                auVar62._12_4_ = fStack_5b4;
                auVar83 = vfmadd132ps_fma(auVar62,auVar83,local_680._0_16_);
                auVar174._0_4_ = auVar83._0_4_ * (float)local_5d0._0_4_;
                auVar174._4_4_ = auVar83._4_4_ * (float)local_5d0._0_4_;
                auVar174._8_4_ = auVar83._8_4_ * (float)local_5d0._0_4_;
                auVar174._12_4_ = auVar83._12_4_ * (float)local_5d0._0_4_;
                auVar83 = vdpps_avx(auVar3,auVar83,0x7f);
                fVar159 = auVar83._0_4_;
                auVar192._0_4_ = auVar3._0_4_ * fVar159;
                auVar192._4_4_ = auVar3._4_4_ * fVar159;
                auVar192._8_4_ = auVar3._8_4_ * fVar159;
                auVar192._12_4_ = auVar3._12_4_ * fVar159;
                auVar5 = vsubps_avx(auVar174,auVar192);
                fVar159 = auVar82._0_4_ * (float)local_5e0._0_4_;
                auVar83 = vmaxss_avx(ZEXT416((uint)fVar201),
                                     ZEXT416((uint)((float)local_860._0_4_ * fVar233 * 1.9073486e-06
                                                   )));
                auVar21._8_4_ = 0x80000000;
                auVar21._0_8_ = 0x8000000080000000;
                auVar21._12_4_ = 0x80000000;
                auVar128._16_16_ = auVar92._16_16_;
                auVar85 = vxorps_avx512vl(auVar3,auVar21);
                auVar193._0_4_ = fVar224 * auVar5._0_4_ * fVar159;
                auVar193._4_4_ = fVar179 * auVar5._4_4_ * fVar159;
                auVar193._8_4_ = fVar236 * auVar5._8_4_ * fVar159;
                auVar193._12_4_ = fVar157 * auVar5._12_4_ * fVar159;
                auVar242 = ZEXT1664(local_820);
                auVar82 = vdpps_avx(auVar85,local_820,0x7f);
                auVar5 = vfmadd213ss_fma(auVar81,ZEXT416((uint)fVar201),auVar83);
                auVar81 = vdpps_avx(local_700._0_16_,auVar193,0x7f);
                auVar5 = vfmadd213ss_fma(ZEXT416((uint)(fVar234 + 1.0)),
                                         ZEXT416((uint)(fVar201 / fVar232)),auVar5);
                auVar248 = ZEXT1664(auVar5);
                fVar224 = auVar82._0_4_ + auVar81._0_4_;
                auVar81 = vdpps_avx(local_660._0_16_,local_820,0x7f);
                auVar82 = vdpps_avx(local_700._0_16_,auVar85,0x7f);
                auVar84 = vmulss_avx512f(auVar84,auVar79);
                auVar85 = vaddss_avx512f(auVar80,ZEXT416((uint)(auVar84._0_4_ *
                                                               auVar79._0_4_ * auVar79._0_4_)));
                auVar79 = vdpps_avx(local_700._0_16_,local_660._0_16_,0x7f);
                auVar80 = vfnmadd231ss_fma(auVar82,auVar4,ZEXT416((uint)fVar224));
                auVar84 = vfnmadd231ss_fma(auVar79,auVar4,auVar81);
                auVar82 = vpermilps_avx(local_5b0,0xff);
                fVar235 = fVar235 - auVar82._0_4_;
                auVar82 = vshufps_avx(auVar3,auVar3,0xff);
                auVar79 = vfmsub213ss_fma(auVar80,auVar85,auVar82);
                fVar179 = auVar84._0_4_ * auVar85._0_4_;
                auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar81._0_4_ * auVar79._0_4_)),
                                          ZEXT416((uint)fVar224),ZEXT416((uint)fVar179));
                fVar232 = auVar80._0_4_;
                fVar179 = auVar4._0_4_ * (fVar179 / fVar232) - fVar235 * (auVar81._0_4_ / fVar232);
                auVar223 = ZEXT464((uint)fVar179);
                fVar238 = fVar238 - fVar179;
                auVar239 = ZEXT464((uint)fVar238);
                fVar237 = (float)local_860._0_4_ -
                          (fVar235 * (fVar224 / fVar232) - auVar4._0_4_ * (auVar79._0_4_ / fVar232))
                ;
                auVar230 = ZEXT464((uint)fVar237);
                auVar215._8_4_ = 0x7fffffff;
                auVar215._0_8_ = 0x7fffffff7fffffff;
                auVar215._12_4_ = 0x7fffffff;
                auVar81 = vandps_avx(auVar4,auVar215);
                bVar75 = true;
                fVar224 = (float)local_740._0_4_;
                fVar179 = (float)local_740._4_4_;
                fVar232 = fStack_738;
                fVar234 = fStack_734;
                fVar236 = fStack_730;
                fVar157 = fStack_72c;
                fVar159 = fStack_728;
                fVar161 = fStack_724;
                if (auVar81._0_4_ < auVar5._0_4_) {
                  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ + auVar83._0_4_)),local_620,
                                           ZEXT416(0x36000000));
                  auVar81 = vandps_avx(ZEXT416((uint)fVar235),auVar215);
                  if (auVar81._0_4_ < auVar4._0_4_) {
                    fVar237 = fVar237 + (float)local_610._0_4_;
                    auVar230 = ZEXT464((uint)fVar237);
                    if ((ray->org).field_0.m128[3] <= fVar237) {
                      fVar235 = ray->tfar;
                      auVar223 = ZEXT464((uint)fVar235);
                      if (((fVar237 <= fVar235) && (0.0 <= fVar238)) && (fVar238 <= 1.0)) {
                        auVar128._0_16_ = ZEXT816(0) << 0x20;
                        auVar127._4_28_ = auVar128._4_28_;
                        auVar127._0_4_ = local_720._0_4_;
                        auVar81 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar127._0_16_);
                        fVar243 = auVar81._0_4_;
                        auVar81 = vmulss_avx512f(local_720._0_16_,ZEXT416(0xbf000000));
                        pGVar7 = (context->scene->geometries).items[local_868].ptr;
                        if ((pGVar7->mask & ray->mask) != 0) {
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                            unaff_R13 = 1;
                          }
                          else {
                            fVar224 = fVar243 * 1.5 + auVar81._0_4_ * fVar243 * fVar243 * fVar243;
                            auVar175._0_4_ = local_700._0_4_ * fVar224;
                            auVar175._4_4_ = local_700._4_4_ * fVar224;
                            auVar175._8_4_ = local_700._8_4_ * fVar224;
                            auVar175._12_4_ = local_700._12_4_ * fVar224;
                            auVar79 = vfmadd213ps_fma(auVar82,auVar175,auVar3);
                            auVar81 = vshufps_avx(auVar175,auVar175,0xc9);
                            auVar82 = vshufps_avx(auVar3,auVar3,0xc9);
                            auVar176._0_4_ = auVar175._0_4_ * auVar82._0_4_;
                            auVar176._4_4_ = auVar175._4_4_ * auVar82._4_4_;
                            auVar176._8_4_ = auVar175._8_4_ * auVar82._8_4_;
                            auVar176._12_4_ = auVar175._12_4_ * auVar82._12_4_;
                            auVar4 = vfmsub231ps_fma(auVar176,auVar3,auVar81);
                            auVar81 = vshufps_avx(auVar4,auVar4,0xc9);
                            auVar82 = vshufps_avx(auVar79,auVar79,0xc9);
                            auVar4 = vshufps_avx(auVar4,auVar4,0xd2);
                            auVar144._0_4_ = auVar79._0_4_ * auVar4._0_4_;
                            auVar144._4_4_ = auVar79._4_4_ * auVar4._4_4_;
                            auVar144._8_4_ = auVar79._8_4_ * auVar4._8_4_;
                            auVar144._12_4_ = auVar79._12_4_ * auVar4._12_4_;
                            auVar82 = vfmsub231ps_fma(auVar144,auVar81,auVar82);
                            auVar81 = vshufps_avx(auVar82,auVar82,0xe9);
                            local_790 = vmovlps_avx(auVar81);
                            local_788 = auVar82._0_4_;
                            local_780 = 0;
                            local_77c = (undefined4)local_870;
                            local_778 = (undefined4)local_868;
                            local_774 = context->user->instID[0];
                            local_770 = context->user->instPrimID[0];
                            ray->tfar = fVar237;
                            local_8c4 = -1;
                            local_7f0.valid = &local_8c4;
                            local_7f0.geometryUserPtr = pGVar7->userPtr;
                            local_7f0.context = context->user;
                            local_7f0.hit = (RTCHitN *)&local_790;
                            local_7f0.N = 1;
                            local_8c0._0_16_ = ZEXT416((uint)fVar238);
                            local_860._0_16_ = ZEXT416((uint)fVar237);
                            local_8a0._0_4_ = fVar235;
                            local_7f0.ray = (RTCRayN *)ray;
                            local_784 = fVar238;
                            if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01e079f8:
                              p_Var8 = context->args->filter;
                              fVar224 = (float)local_740._0_4_;
                              fVar179 = (float)local_740._4_4_;
                              fVar232 = fStack_738;
                              fVar234 = fStack_734;
                              fVar236 = fStack_730;
                              fVar157 = fStack_72c;
                              fVar159 = fStack_728;
                              fVar161 = fStack_724;
                              if (p_Var8 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                                  auVar231 = ZEXT1664(auVar231._0_16_);
                                  auVar242 = ZEXT1664(auVar242._0_16_);
                                  auVar246 = ZEXT1664(auVar246._0_16_);
                                  auVar248 = ZEXT1664(auVar248._0_16_);
                                  (*p_Var8)(&local_7f0);
                                  auVar223 = ZEXT464((uint)local_8a0._0_4_);
                                  auVar230 = ZEXT1664(local_860._0_16_);
                                  auVar239 = ZEXT1664(local_8c0._0_16_);
                                  auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar249 = ZEXT3264(auVar92);
                                  fVar224 = (float)local_740._0_4_;
                                  fVar179 = (float)local_740._4_4_;
                                  fVar232 = fStack_738;
                                  fVar234 = fStack_734;
                                  fVar236 = fStack_730;
                                  fVar157 = fStack_72c;
                                  fVar159 = fStack_728;
                                  fVar161 = fStack_724;
                                }
                                if (*local_7f0.valid == 0) goto LAB_01e07a5d;
                              }
                              unaff_R13 = 1;
                            }
                            else {
                              auVar231 = ZEXT1664(local_700._0_16_);
                              auVar242 = ZEXT1664(local_820);
                              auVar246 = ZEXT1664(auVar3);
                              auVar248 = ZEXT1664(auVar5);
                              (*pGVar7->occlusionFilterN)(&local_7f0);
                              auVar223 = ZEXT464((uint)local_8a0._0_4_);
                              auVar230 = ZEXT1664(local_860._0_16_);
                              auVar239 = ZEXT1664(local_8c0._0_16_);
                              auVar92 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar249 = ZEXT3264(auVar92);
                              fVar224 = (float)local_740._0_4_;
                              fVar179 = (float)local_740._4_4_;
                              fVar232 = fStack_738;
                              fVar234 = fStack_734;
                              fVar236 = fStack_730;
                              fVar157 = fStack_72c;
                              fVar159 = fStack_728;
                              fVar161 = fStack_724;
                              if (*local_7f0.valid != 0) goto LAB_01e079f8;
LAB_01e07a5d:
                              unaff_R13 = 0;
                            }
                            if ((char)unaff_R13 == '\0') {
                              ray->tfar = auVar223._0_4_;
                            }
                          }
                          bVar75 = false;
                          goto LAB_01e0787d;
                        }
                      }
                    }
                    bVar75 = false;
                    unaff_R13 = 0;
                  }
                }
LAB_01e0787d:
                bVar70 = (byte)unaff_R13;
                if (!bVar75) goto LAB_01e07a77;
                lVar74 = lVar74 + -1;
              } while (lVar74 != 0);
              bVar70 = 0;
LAB_01e07a77:
              unaff_R13 = (ulong)(bVar70 & 1);
              bVar69 = bVar69 | bVar70 & 1;
              auVar64._4_4_ = fStack_55c;
              auVar64._0_4_ = local_560;
              auVar64._8_4_ = fStack_558;
              auVar64._12_4_ = fStack_554;
              auVar64._16_4_ = fStack_550;
              auVar64._20_4_ = fStack_54c;
              auVar64._24_4_ = fStack_548;
              auVar64._28_4_ = fStack_544;
              fVar233 = ray->tfar;
              auVar31._4_4_ = fVar233;
              auVar31._0_4_ = fVar233;
              auVar31._8_4_ = fVar233;
              auVar31._12_4_ = fVar233;
              auVar31._16_4_ = fVar233;
              auVar31._20_4_ = fVar233;
              auVar31._24_4_ = fVar233;
              auVar31._28_4_ = fVar233;
              uVar16 = vcmpps_avx512vl(auVar64,auVar31,2);
              bVar73 = ~('\x01' << ((byte)iVar19 & 0x1f)) & bVar73 & (byte)uVar16;
            } while (bVar73 != 0);
          }
          uVar17 = vpcmpd_avx512vl(local_500,_local_580,1);
          uVar18 = vpcmpd_avx512vl(local_500,local_3e0,1);
          auVar177._0_4_ = fVar224 + (float)local_460._0_4_;
          auVar177._4_4_ = fVar179 + (float)local_460._4_4_;
          auVar177._8_4_ = fVar232 + fStack_458;
          auVar177._12_4_ = fVar234 + fStack_454;
          auVar177._16_4_ = fVar236 + fStack_450;
          auVar177._20_4_ = fVar157 + fStack_44c;
          auVar177._24_4_ = fVar159 + fStack_448;
          auVar177._28_4_ = fVar161 + fStack_444;
          fVar201 = ray->tfar;
          auVar194._4_4_ = fVar201;
          auVar194._0_4_ = fVar201;
          auVar194._8_4_ = fVar201;
          auVar194._12_4_ = fVar201;
          auVar194._16_4_ = fVar201;
          auVar194._20_4_ = fVar201;
          auVar194._24_4_ = fVar201;
          auVar194._28_4_ = fVar201;
          uVar16 = vcmpps_avx512vl(auVar177,auVar194,2);
          bVar73 = (byte)local_7f8 & (byte)uVar18 & (byte)uVar16;
          auVar210._0_4_ = fVar224 + (float)local_420._0_4_;
          auVar210._4_4_ = fVar179 + (float)local_420._4_4_;
          auVar210._8_4_ = fVar232 + fStack_418;
          auVar210._12_4_ = fVar234 + fStack_414;
          auVar210._16_4_ = fVar236 + fStack_410;
          auVar210._20_4_ = fVar157 + fStack_40c;
          auVar210._24_4_ = fVar159 + fStack_408;
          auVar210._28_4_ = fVar161 + fStack_404;
          uVar16 = vcmpps_avx512vl(auVar210,auVar194,2);
          bVar71 = bVar71 & (byte)uVar17 & (byte)uVar16 | bVar73;
          if (bVar71 != 0) {
            uVar77 = local_748 & 0xffffffff;
            abStack_180[uVar77 * 0x60] = bVar71;
            auVar129._0_4_ =
                 (uint)(bVar73 & 1) * local_460._0_4_ | (uint)!(bool)(bVar73 & 1) * local_420._0_4_;
            bVar75 = (bool)(bVar73 >> 1 & 1);
            auVar129._4_4_ = (uint)bVar75 * local_460._4_4_ | (uint)!bVar75 * local_420._4_4_;
            bVar75 = (bool)(bVar73 >> 2 & 1);
            auVar129._8_4_ = (uint)bVar75 * (int)fStack_458 | (uint)!bVar75 * (int)fStack_418;
            bVar75 = (bool)(bVar73 >> 3 & 1);
            auVar129._12_4_ = (uint)bVar75 * (int)fStack_454 | (uint)!bVar75 * (int)fStack_414;
            bVar75 = (bool)(bVar73 >> 4 & 1);
            auVar129._16_4_ = (uint)bVar75 * (int)fStack_450 | (uint)!bVar75 * (int)fStack_410;
            bVar75 = (bool)(bVar73 >> 5 & 1);
            auVar129._20_4_ = (uint)bVar75 * (int)fStack_44c | (uint)!bVar75 * (int)fStack_40c;
            bVar75 = (bool)(bVar73 >> 6 & 1);
            auVar129._24_4_ = (uint)bVar75 * (int)fStack_448 | (uint)!bVar75 * (int)fStack_408;
            auVar129._28_4_ =
                 (uint)(bVar73 >> 7) * (int)fStack_444 |
                 (uint)!(bool)(bVar73 >> 7) * (int)fStack_404;
            *(undefined1 (*) [32])(auStack_160 + uVar77 * 0x60) = auVar129;
            uVar16 = vmovlps_avx(local_630);
            *(undefined8 *)(afStack_140 + uVar77 * 0x18) = uVar16;
            auStack_138[uVar77 * 0x18] = (int)local_808 + 1;
            local_748 = (ulong)((int)local_748 + 1);
          }
          auVar211 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                         &
                                                  DAT_3f8000003f800000)))))));
          prim = local_758;
        }
      }
    }
    fVar201 = ray->tfar;
    auVar153._4_4_ = fVar201;
    auVar153._0_4_ = fVar201;
    auVar153._8_4_ = fVar201;
    auVar153._12_4_ = fVar201;
    auVar153._16_4_ = fVar201;
    auVar153._20_4_ = fVar201;
    auVar153._24_4_ = fVar201;
    auVar153._28_4_ = fVar201;
    uVar77 = local_748;
    do {
      if ((int)uVar77 == 0) {
        if (bVar69 != 0) {
          return bVar76;
        }
        fVar224 = ray->tfar;
        auVar32._4_4_ = fVar224;
        auVar32._0_4_ = fVar224;
        auVar32._8_4_ = fVar224;
        auVar32._12_4_ = fVar224;
        auVar32._16_4_ = fVar224;
        auVar32._20_4_ = fVar224;
        auVar32._24_4_ = fVar224;
        auVar32._28_4_ = fVar224;
        uVar16 = vcmpps_avx512vl(local_3c0,auVar32,2);
        uVar78 = (uint)local_750 & (uint)uVar16;
        local_750 = (ulong)uVar78;
        bVar76 = uVar78 != 0;
        if (!bVar76) {
          return bVar76;
        }
        goto LAB_01e0589a;
      }
      uVar72 = (ulong)((int)uVar77 - 1);
      lVar74 = uVar72 * 0x60;
      auVar92 = *(undefined1 (*) [32])(auStack_160 + lVar74);
      auVar195._0_4_ = fVar224 + auVar92._0_4_;
      auVar195._4_4_ = fVar179 + auVar92._4_4_;
      auVar195._8_4_ = fVar232 + auVar92._8_4_;
      auVar195._12_4_ = fVar234 + auVar92._12_4_;
      auVar195._16_4_ = fVar236 + auVar92._16_4_;
      auVar195._20_4_ = fVar157 + auVar92._20_4_;
      auVar195._24_4_ = fVar159 + auVar92._24_4_;
      auVar195._28_4_ = fVar161 + auVar92._28_4_;
      uVar16 = vcmpps_avx512vl(auVar195,auVar153,2);
      uVar78 = (uint)uVar16 & (uint)abStack_180[lVar74];
      bVar71 = (byte)uVar78;
      local_748 = uVar72;
      if (uVar78 != 0) {
        auVar196._8_4_ = 0x7f800000;
        auVar196._0_8_ = 0x7f8000007f800000;
        auVar196._12_4_ = 0x7f800000;
        auVar196._16_4_ = 0x7f800000;
        auVar196._20_4_ = 0x7f800000;
        auVar196._24_4_ = 0x7f800000;
        auVar196._28_4_ = 0x7f800000;
        auVar93 = vblendmps_avx512vl(auVar196,auVar92);
        auVar130._0_4_ =
             (uint)(bVar71 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar71 & 1) * (int)auVar92._0_4_;
        bVar75 = (bool)((byte)(uVar78 >> 1) & 1);
        auVar130._4_4_ = (uint)bVar75 * auVar93._4_4_ | (uint)!bVar75 * (int)auVar92._4_4_;
        bVar75 = (bool)((byte)(uVar78 >> 2) & 1);
        auVar130._8_4_ = (uint)bVar75 * auVar93._8_4_ | (uint)!bVar75 * (int)auVar92._8_4_;
        bVar75 = (bool)((byte)(uVar78 >> 3) & 1);
        auVar130._12_4_ = (uint)bVar75 * auVar93._12_4_ | (uint)!bVar75 * (int)auVar92._12_4_;
        bVar75 = (bool)((byte)(uVar78 >> 4) & 1);
        auVar130._16_4_ = (uint)bVar75 * auVar93._16_4_ | (uint)!bVar75 * (int)auVar92._16_4_;
        bVar75 = (bool)((byte)(uVar78 >> 5) & 1);
        auVar130._20_4_ = (uint)bVar75 * auVar93._20_4_ | (uint)!bVar75 * (int)auVar92._20_4_;
        bVar75 = (bool)((byte)(uVar78 >> 6) & 1);
        auVar130._24_4_ = (uint)bVar75 * auVar93._24_4_ | (uint)!bVar75 * (int)auVar92._24_4_;
        auVar130._28_4_ =
             (uVar78 >> 7) * auVar93._28_4_ | (uint)!SUB41(uVar78 >> 7,0) * (int)auVar92._28_4_;
        auVar92 = vshufps_avx(auVar130,auVar130,0xb1);
        auVar92 = vminps_avx(auVar130,auVar92);
        auVar93 = vshufpd_avx(auVar92,auVar92,5);
        auVar92 = vminps_avx(auVar92,auVar93);
        auVar93 = vpermpd_avx2(auVar92,0x4e);
        auVar92 = vminps_avx(auVar92,auVar93);
        uVar16 = vcmpps_avx512vl(auVar130,auVar92,0);
        bVar73 = (byte)uVar16 & bVar71;
        if (bVar73 != 0) {
          uVar78 = (uint)bVar73;
        }
        fVar201 = afStack_140[uVar72 * 0x18 + 1];
        uVar131 = 0;
        for (; (uVar78 & 1) == 0; uVar78 = uVar78 >> 1 | 0x80000000) {
          uVar131 = uVar131 + 1;
        }
        unaff_R13 = (ulong)auStack_138[uVar72 * 0x18];
        bVar73 = ~('\x01' << ((byte)uVar131 & 0x1f)) & bVar71;
        abStack_180[lVar74] = bVar73;
        auVar211 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
        if (bVar73 != 0) {
          local_748 = uVar77 & 0xffffffff;
        }
        fVar233 = afStack_140[uVar72 * 0x18];
        auVar197._4_4_ = fVar233;
        auVar197._0_4_ = fVar233;
        auVar197._8_4_ = fVar233;
        auVar197._12_4_ = fVar233;
        auVar197._16_4_ = fVar233;
        auVar197._20_4_ = fVar233;
        auVar197._24_4_ = fVar233;
        auVar197._28_4_ = fVar233;
        fVar201 = fVar201 - fVar233;
        auVar178._4_4_ = fVar201;
        auVar178._0_4_ = fVar201;
        auVar178._8_4_ = fVar201;
        auVar178._12_4_ = fVar201;
        auVar178._16_4_ = fVar201;
        auVar178._20_4_ = fVar201;
        auVar178._24_4_ = fVar201;
        auVar178._28_4_ = fVar201;
        auVar81 = vfmadd132ps_fma(auVar178,auVar197,_DAT_02020f20);
        _local_460 = ZEXT1632(auVar81);
        local_630._8_8_ = 0;
        local_630._0_8_ = *(ulong *)(local_460 + (ulong)uVar131 * 4);
        local_808 = unaff_R13;
      }
      uVar77 = local_748;
    } while (bVar71 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }